

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx512::CurveNvIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  undefined1 auVar58 [32];
  float fVar59;
  byte bVar60;
  ulong uVar61;
  ulong uVar62;
  uint uVar63;
  uint uVar64;
  ulong uVar65;
  long lVar66;
  Geometry *pGVar67;
  undefined8 in_R10;
  ulong uVar68;
  long lVar69;
  long lVar70;
  byte bVar71;
  ulong uVar72;
  float fVar73;
  float fVar132;
  float fVar134;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar74;
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar86 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar87 [16];
  float fVar133;
  float fVar135;
  float fVar137;
  float fVar138;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar88 [16];
  float fVar136;
  float fVar139;
  float fVar140;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined4 uVar141;
  float fVar155;
  float fVar156;
  vint4 bi_2;
  float fVar157;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined8 uVar158;
  vint4 bi_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  float fVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar173;
  float fVar182;
  vint4 ai_2;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  vint4 bi;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  vint4 ai;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar205 [64];
  vint4 ai_1;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [64];
  float fVar210;
  float fVar211;
  undefined1 auVar209 [16];
  float fVar212;
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  Geometry *local_5f8;
  RayHitK<8> *local_5f0;
  undefined1 (*local_5e8) [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [16];
  long local_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  int local_39c;
  undefined1 local_390 [16];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  
  uVar61 = (ulong)(byte)prim[1];
  fVar163 = *(float *)(prim + uVar61 * 0x19 + 0x12);
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar78 = vsubps_avx(auVar78,*(undefined1 (*) [16])(prim + uVar61 * 0x19 + 6));
  auVar174._0_4_ = fVar163 * auVar78._0_4_;
  auVar174._4_4_ = fVar163 * auVar78._4_4_;
  auVar174._8_4_ = fVar163 * auVar78._8_4_;
  auVar174._12_4_ = fVar163 * auVar78._12_4_;
  auVar86._0_4_ = fVar163 * auVar79._0_4_;
  auVar86._4_4_ = fVar163 * auVar79._4_4_;
  auVar86._8_4_ = fVar163 * auVar79._8_4_;
  auVar86._12_4_ = fVar163 * auVar79._12_4_;
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xb + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xc + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xd + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x12 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x13 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x14 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar219._4_4_ = auVar86._0_4_;
  auVar219._0_4_ = auVar86._0_4_;
  auVar219._8_4_ = auVar86._0_4_;
  auVar219._12_4_ = auVar86._0_4_;
  auVar17 = vshufps_avx(auVar86,auVar86,0x55);
  auVar80 = vshufps_avx(auVar86,auVar86,0xaa);
  fVar163 = auVar80._0_4_;
  auVar183._0_4_ = fVar163 * auVar75._0_4_;
  fVar155 = auVar80._4_4_;
  auVar183._4_4_ = fVar155 * auVar75._4_4_;
  fVar156 = auVar80._8_4_;
  auVar183._8_4_ = fVar156 * auVar75._8_4_;
  fVar157 = auVar80._12_4_;
  auVar183._12_4_ = fVar157 * auVar75._12_4_;
  auVar88._0_4_ = auVar76._0_4_ * fVar163;
  auVar88._4_4_ = auVar76._4_4_ * fVar155;
  auVar88._8_4_ = auVar76._8_4_ * fVar156;
  auVar88._12_4_ = auVar76._12_4_ * fVar157;
  auVar142._0_4_ = auVar77._0_4_ * fVar163;
  auVar142._4_4_ = auVar77._4_4_ * fVar155;
  auVar142._8_4_ = auVar77._8_4_ * fVar156;
  auVar142._12_4_ = auVar77._12_4_ * fVar157;
  auVar80 = vfmadd231ps_fma(auVar183,auVar17,auVar79);
  auVar82 = vfmadd231ps_fma(auVar88,auVar17,auVar85);
  auVar17 = vfmadd231ps_fma(auVar142,auVar83,auVar17);
  auVar81 = vfmadd231ps_fma(auVar80,auVar219,auVar78);
  auVar82 = vfmadd231ps_fma(auVar82,auVar219,auVar89);
  auVar86 = vfmadd231ps_fma(auVar17,auVar84,auVar219);
  auVar220._4_4_ = auVar174._0_4_;
  auVar220._0_4_ = auVar174._0_4_;
  auVar220._8_4_ = auVar174._0_4_;
  auVar220._12_4_ = auVar174._0_4_;
  auVar17 = vshufps_avx(auVar174,auVar174,0x55);
  auVar80 = vshufps_avx(auVar174,auVar174,0xaa);
  auVar75 = vmulps_avx512vl(auVar80,auVar75);
  auVar175._0_4_ = auVar80._0_4_ * auVar76._0_4_;
  auVar175._4_4_ = auVar80._4_4_ * auVar76._4_4_;
  auVar175._8_4_ = auVar80._8_4_ * auVar76._8_4_;
  auVar175._12_4_ = auVar80._12_4_ * auVar76._12_4_;
  auVar164._0_4_ = auVar80._0_4_ * auVar77._0_4_;
  auVar164._4_4_ = auVar80._4_4_ * auVar77._4_4_;
  auVar164._8_4_ = auVar80._8_4_ * auVar77._8_4_;
  auVar164._12_4_ = auVar80._12_4_ * auVar77._12_4_;
  auVar76 = vfmadd231ps_avx512vl(auVar75,auVar17,auVar79);
  auVar79 = vfmadd231ps_fma(auVar175,auVar17,auVar85);
  auVar75 = vfmadd231ps_fma(auVar164,auVar17,auVar83);
  auVar77 = vfmadd231ps_avx512vl(auVar76,auVar220,auVar78);
  auVar85 = vfmadd231ps_fma(auVar79,auVar220,auVar89);
  auVar83 = vfmadd231ps_fma(auVar75,auVar220,auVar84);
  auVar78 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar225 = ZEXT1664(auVar78);
  auVar197._8_4_ = 0x219392ef;
  auVar197._0_8_ = 0x219392ef219392ef;
  auVar197._12_4_ = 0x219392ef;
  auVar79 = vandps_avx512vl(auVar81,auVar78);
  uVar68 = vcmpps_avx512vl(auVar79,auVar197,1);
  bVar10 = (bool)((byte)uVar68 & 1);
  auVar80._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar81._0_4_;
  bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar81._4_4_;
  bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar81._8_4_;
  bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar81._12_4_;
  auVar79 = vandps_avx512vl(auVar82,auVar78);
  uVar68 = vcmpps_avx512vl(auVar79,auVar197,1);
  bVar10 = (bool)((byte)uVar68 & 1);
  auVar81._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar82._0_4_;
  bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar82._4_4_;
  bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar82._8_4_;
  bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar82._12_4_;
  auVar78 = vandps_avx512vl(auVar86,auVar78);
  uVar68 = vcmpps_avx512vl(auVar78,auVar197,1);
  bVar10 = (bool)((byte)uVar68 & 1);
  auVar82._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar86._0_4_;
  bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar86._4_4_;
  bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar86._8_4_;
  bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar86._12_4_;
  auVar79 = vrcp14ps_avx512vl(auVar80);
  auVar206._8_4_ = 0x3f800000;
  auVar206._0_8_ = 0x3f8000003f800000;
  auVar206._12_4_ = 0x3f800000;
  auVar78 = vfnmadd213ps_fma(auVar80,auVar79,auVar206);
  auVar75 = vfmadd132ps_fma(auVar78,auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar81);
  auVar78 = vfnmadd213ps_fma(auVar81,auVar79,auVar206);
  auVar76 = vfmadd132ps_fma(auVar78,auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar82);
  auVar78 = vfnmadd213ps_fma(auVar82,auVar79,auVar206);
  auVar84 = vfmadd132ps_fma(auVar78,auVar79,auVar79);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar78 = vpmovsxwd_avx(auVar78);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx512vl(auVar78,auVar77);
  auVar198._0_4_ = auVar75._0_4_ * auVar78._0_4_;
  auVar198._4_4_ = auVar75._4_4_ * auVar78._4_4_;
  auVar198._8_4_ = auVar75._8_4_ * auVar78._8_4_;
  auVar198._12_4_ = auVar75._12_4_ * auVar78._12_4_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar78 = vpmovsxwd_avx(auVar79);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx512vl(auVar78,auVar77);
  auVar184._0_4_ = auVar75._0_4_ * auVar78._0_4_;
  auVar184._4_4_ = auVar75._4_4_ * auVar78._4_4_;
  auVar184._8_4_ = auVar75._8_4_ * auVar78._8_4_;
  auVar184._12_4_ = auVar75._12_4_ * auVar78._12_4_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar61 * 0xe + 6);
  auVar78 = vpmovsxwd_avx(auVar75);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar85);
  auVar207._0_4_ = auVar76._0_4_ * auVar78._0_4_;
  auVar207._4_4_ = auVar76._4_4_ * auVar78._4_4_;
  auVar207._8_4_ = auVar76._8_4_ * auVar78._8_4_;
  auVar207._12_4_ = auVar76._12_4_ * auVar78._12_4_;
  auVar75 = vpbroadcastd_avx512vl();
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar78 = vpmovsxwd_avx(auVar89);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar79 = vsubps_avx(auVar78,auVar85);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar61 * 0x15 + 6);
  auVar78 = vpmovsxwd_avx(auVar85);
  auVar159._0_4_ = auVar76._0_4_ * auVar79._0_4_;
  auVar159._4_4_ = auVar76._4_4_ * auVar79._4_4_;
  auVar159._8_4_ = auVar76._8_4_ * auVar79._8_4_;
  auVar159._12_4_ = auVar76._12_4_ * auVar79._12_4_;
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar83);
  auVar176._0_4_ = auVar84._0_4_ * auVar78._0_4_;
  auVar176._4_4_ = auVar84._4_4_ * auVar78._4_4_;
  auVar176._8_4_ = auVar84._8_4_ * auVar78._8_4_;
  auVar176._12_4_ = auVar84._12_4_ * auVar78._12_4_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar61 * 0x17 + 6);
  auVar78 = vpmovsxwd_avx(auVar76);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar83);
  auVar87._0_4_ = auVar84._0_4_ * auVar78._0_4_;
  auVar87._4_4_ = auVar84._4_4_ * auVar78._4_4_;
  auVar87._8_4_ = auVar84._8_4_ * auVar78._8_4_;
  auVar87._12_4_ = auVar84._12_4_ * auVar78._12_4_;
  auVar78 = vpminsd_avx(auVar198,auVar184);
  auVar79 = vpminsd_avx(auVar207,auVar159);
  auVar78 = vmaxps_avx(auVar78,auVar79);
  auVar79 = vpminsd_avx(auVar176,auVar87);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar84._4_4_ = uVar3;
  auVar84._0_4_ = uVar3;
  auVar84._8_4_ = uVar3;
  auVar84._12_4_ = uVar3;
  auVar79 = vmaxps_avx512vl(auVar79,auVar84);
  auVar78 = vmaxps_avx(auVar78,auVar79);
  auVar83._8_4_ = 0x3f7ffffa;
  auVar83._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar83._12_4_ = 0x3f7ffffa;
  local_5a0 = vmulps_avx512vl(auVar78,auVar83);
  auVar226 = ZEXT1664(local_5a0);
  auVar78 = vpmaxsd_avx(auVar198,auVar184);
  auVar79 = vpmaxsd_avx(auVar207,auVar159);
  auVar78 = vminps_avx(auVar78,auVar79);
  auVar79 = vpmaxsd_avx(auVar176,auVar87);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar77._4_4_ = uVar3;
  auVar77._0_4_ = uVar3;
  auVar77._8_4_ = uVar3;
  auVar77._12_4_ = uVar3;
  auVar79 = vminps_avx512vl(auVar79,auVar77);
  auVar78 = vminps_avx(auVar78,auVar79);
  auVar17._8_4_ = 0x3f800003;
  auVar17._0_8_ = 0x3f8000033f800003;
  auVar17._12_4_ = 0x3f800003;
  auVar78 = vmulps_avx512vl(auVar78,auVar17);
  uVar158 = vcmpps_avx512vl(local_5a0,auVar78,2);
  uVar18 = vpcmpgtd_avx512vl(auVar75,_DAT_01f4ad30);
  uVar68 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)((byte)uVar158 & 0xf & (byte)uVar18));
  local_5e8 = (undefined1 (*) [32])&local_140;
  local_2e0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar227 = ZEXT3264(_DAT_01f7b060);
  local_5f0 = ray;
  do {
    if (uVar68 == 0) {
      return;
    }
    lVar66 = 0;
    for (uVar62 = uVar68; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
      lVar66 = lVar66 + 1;
    }
    uVar68 = uVar68 - 1 & uVar68;
    uVar3 = *(undefined4 *)(prim + lVar66 * 4 + 6);
    uVar62 = (ulong)(uint)((int)lVar66 << 6);
    uVar6 = *(uint *)(prim + 2);
    pGVar67 = (context->scene->geometries).items[uVar6].ptr;
    local_5e0._0_8_ = pGVar67;
    auVar78 = *(undefined1 (*) [16])(prim + uVar62 + uVar61 * 0x19 + 0x16);
    if (uVar68 != 0) {
      uVar65 = uVar68 - 1 & uVar68;
      for (uVar72 = uVar68; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
      }
      if (uVar65 != 0) {
        for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar79 = *(undefined1 (*) [16])(prim + uVar62 + uVar61 * 0x19 + 0x26);
    auVar75 = *(undefined1 (*) [16])(prim + uVar62 + uVar61 * 0x19 + 0x36);
    auVar89 = *(undefined1 (*) [16])(prim + uVar62 + uVar61 * 0x19 + 0x46);
    iVar7 = (int)pGVar67[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar84 = vsubps_avx(auVar78,auVar85);
    uVar141 = auVar84._0_4_;
    auVar165._4_4_ = uVar141;
    auVar165._0_4_ = uVar141;
    auVar165._8_4_ = uVar141;
    auVar165._12_4_ = uVar141;
    auVar76 = vshufps_avx(auVar84,auVar84,0x55);
    aVar4 = pre->ray_space[k].vx.field_0;
    aVar5 = pre->ray_space[k].vy.field_0;
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    fVar163 = pre->ray_space[k].vz.field_0.m128[0];
    fVar155 = pre->ray_space[k].vz.field_0.m128[1];
    fVar156 = pre->ray_space[k].vz.field_0.m128[2];
    fVar157 = pre->ray_space[k].vz.field_0.m128[3];
    auVar209._0_4_ = fVar163 * auVar84._0_4_;
    auVar209._4_4_ = fVar155 * auVar84._4_4_;
    auVar209._8_4_ = fVar156 * auVar84._8_4_;
    auVar209._12_4_ = fVar157 * auVar84._12_4_;
    auVar76 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar5,auVar76);
    auVar77 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar4,auVar165);
    auVar76 = vshufps_avx(auVar78,auVar78,0xff);
    auVar83 = vsubps_avx(auVar79,auVar85);
    uVar141 = auVar83._0_4_;
    auVar177._4_4_ = uVar141;
    auVar177._0_4_ = uVar141;
    auVar177._8_4_ = uVar141;
    auVar177._12_4_ = uVar141;
    auVar84 = vshufps_avx(auVar83,auVar83,0x55);
    auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
    auVar213._0_4_ = fVar163 * auVar83._0_4_;
    auVar213._4_4_ = fVar155 * auVar83._4_4_;
    auVar213._8_4_ = fVar156 * auVar83._8_4_;
    auVar213._12_4_ = fVar157 * auVar83._12_4_;
    auVar84 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar5,auVar84);
    auVar17 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar177);
    auVar83 = vsubps_avx512vl(auVar75,auVar85);
    uVar141 = auVar83._0_4_;
    auVar178._4_4_ = uVar141;
    auVar178._0_4_ = uVar141;
    auVar178._8_4_ = uVar141;
    auVar178._12_4_ = uVar141;
    auVar84 = vshufps_avx(auVar83,auVar83,0x55);
    auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
    auVar217._0_4_ = fVar163 * auVar83._0_4_;
    auVar217._4_4_ = fVar155 * auVar83._4_4_;
    auVar217._8_4_ = fVar156 * auVar83._8_4_;
    auVar217._12_4_ = fVar157 * auVar83._12_4_;
    auVar84 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar5,auVar84);
    auVar83 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar178);
    auVar84 = vsubps_avx512vl(auVar89,auVar85);
    uVar141 = auVar84._0_4_;
    auVar166._4_4_ = uVar141;
    auVar166._0_4_ = uVar141;
    auVar166._8_4_ = uVar141;
    auVar166._12_4_ = uVar141;
    auVar85 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar221._0_4_ = fVar163 * auVar84._0_4_;
    auVar221._4_4_ = fVar155 * auVar84._4_4_;
    auVar221._8_4_ = fVar156 * auVar84._8_4_;
    auVar221._12_4_ = fVar157 * auVar84._12_4_;
    auVar85 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar5,auVar85);
    auVar84 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar166);
    lVar66 = (long)iVar7;
    lVar69 = lVar66 * 0x44;
    auVar105 = *(undefined1 (*) [32])(bspline_basis0 + lVar69);
    uVar141 = auVar77._0_4_;
    local_420._4_4_ = uVar141;
    local_420._0_4_ = uVar141;
    local_420._8_4_ = uVar141;
    local_420._12_4_ = uVar141;
    local_420._16_4_ = uVar141;
    local_420._20_4_ = uVar141;
    local_420._24_4_ = uVar141;
    local_420._28_4_ = uVar141;
    auVar90._8_4_ = 1;
    auVar90._0_8_ = 0x100000001;
    auVar90._12_4_ = 1;
    auVar90._16_4_ = 1;
    auVar90._20_4_ = 1;
    auVar90._24_4_ = 1;
    auVar90._28_4_ = 1;
    local_440 = vpermps_avx2(auVar90,ZEXT1632(auVar77));
    auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar69 + 0x484);
    local_460 = vbroadcastss_avx512vl(auVar17);
    local_480 = vpermps_avx512vl(auVar90,ZEXT1632(auVar17));
    auVar103 = *(undefined1 (*) [32])(bspline_basis0 + lVar69 + 0x908);
    local_4a0 = vbroadcastss_avx512vl(auVar83);
    local_4c0 = vpermps_avx512vl(auVar90,ZEXT1632(auVar83));
    auVar102 = *(undefined1 (*) [32])(bspline_basis0 + lVar69 + 0xd8c);
    fVar210 = auVar84._0_4_;
    local_4e0._4_4_ = fVar210;
    local_4e0._0_4_ = fVar210;
    fStack_4d8 = fVar210;
    fStack_4d4 = fVar210;
    fStack_4d0 = fVar210;
    fStack_4cc = fVar210;
    fStack_4c8 = fVar210;
    register0x0000139c = fVar210;
    _local_500 = vpermps_avx512vl(auVar90,ZEXT1632(auVar84));
    auVar90 = vmulps_avx512vl(_local_4e0,auVar102);
    auVar91 = vmulps_avx512vl(_local_500,auVar102);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar103,local_4a0);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar103,local_4c0);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar106,local_460);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar106,local_480);
    auVar92 = vfmadd231ps_avx512vl(auVar90,auVar105,local_420);
    auVar205 = ZEXT3264(auVar92);
    auVar93 = vfmadd231ps_avx512vl(auVar91,auVar105,local_440);
    auVar196 = ZEXT3264(auVar93);
    auVar90 = *(undefined1 (*) [32])(bspline_basis1 + lVar69);
    auVar91 = *(undefined1 (*) [32])(bspline_basis1 + lVar69 + 0x484);
    auVar101 = *(undefined1 (*) [32])(bspline_basis1 + lVar69 + 0x908);
    auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar69 + 0xd8c);
    auVar94 = vmulps_avx512vl(_local_4e0,auVar100);
    auVar95 = vmulps_avx512vl(_local_500,auVar100);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_4a0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,local_4c0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,local_460);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_480);
    auVar80 = vfmadd231ps_fma(auVar94,auVar90,local_420);
    auVar208 = ZEXT1664(auVar80);
    auVar82 = vfmadd231ps_fma(auVar95,auVar90,local_440);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar80),auVar92);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar82),auVar93);
    auVar96 = vmulps_avx512vl(auVar93,auVar94);
    auVar97 = vmulps_avx512vl(auVar92,auVar95);
    auVar96 = vsubps_avx512vl(auVar96,auVar97);
    auVar85 = vshufps_avx(auVar79,auVar79,0xff);
    uVar158 = auVar76._0_8_;
    local_80._8_8_ = uVar158;
    local_80._0_8_ = uVar158;
    local_80._16_8_ = uVar158;
    local_80._24_8_ = uVar158;
    local_a0 = vbroadcastsd_avx512vl(auVar85);
    auVar85 = vshufps_avx512vl(auVar75,auVar75,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar85);
    auVar85 = vshufps_avx512vl(auVar89,auVar89,0xff);
    uVar158 = auVar85._0_8_;
    local_e0._8_8_ = uVar158;
    local_e0._0_8_ = uVar158;
    local_e0._16_8_ = uVar158;
    local_e0._24_8_ = uVar158;
    auVar97 = vmulps_avx512vl(local_e0,auVar102);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,local_c0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar106,local_a0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar105,local_80);
    auVar98 = vmulps_avx512vl(local_e0,auVar100);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,local_c0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar91,local_a0);
    auVar81 = vfmadd231ps_fma(auVar98,auVar90,local_80);
    auVar98 = vmulps_avx512vl(auVar95,auVar95);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,auVar94);
    auVar99 = vmaxps_avx512vl(auVar97,ZEXT1632(auVar81));
    auVar99 = vmulps_avx512vl(auVar99,auVar99);
    auVar98 = vmulps_avx512vl(auVar99,auVar98);
    auVar96 = vmulps_avx512vl(auVar96,auVar96);
    uVar158 = vcmpps_avx512vl(auVar96,auVar98,2);
    auVar85 = vblendps_avx(auVar77,auVar78,8);
    auVar142 = auVar225._0_16_;
    auVar76 = vandps_avx512vl(auVar85,auVar142);
    auVar85 = vblendps_avx(auVar17,auVar79,8);
    auVar85 = vandps_avx512vl(auVar85,auVar142);
    auVar76 = vmaxps_avx(auVar76,auVar85);
    auVar85 = vblendps_avx(auVar83,auVar75,8);
    auVar86 = vandps_avx512vl(auVar85,auVar142);
    auVar85 = vblendps_avx(auVar84,auVar89,8);
    auVar85 = vandps_avx512vl(auVar85,auVar142);
    auVar85 = vmaxps_avx(auVar86,auVar85);
    auVar85 = vmaxps_avx(auVar76,auVar85);
    auVar76 = vmovshdup_avx(auVar85);
    auVar76 = vmaxss_avx(auVar76,auVar85);
    auVar85 = vshufpd_avx(auVar85,auVar85,1);
    auVar85 = vmaxss_avx(auVar85,auVar76);
    auVar76 = vcvtsi2ss_avx512f(auVar142,iVar7);
    local_560._0_16_ = auVar76;
    auVar98._0_4_ = auVar76._0_4_;
    auVar98._4_4_ = auVar98._0_4_;
    auVar98._8_4_ = auVar98._0_4_;
    auVar98._12_4_ = auVar98._0_4_;
    auVar98._16_4_ = auVar98._0_4_;
    auVar98._20_4_ = auVar98._0_4_;
    auVar98._24_4_ = auVar98._0_4_;
    auVar98._28_4_ = auVar98._0_4_;
    uVar18 = vcmpps_avx512vl(auVar98,auVar227._0_32_,0xe);
    bVar71 = (byte)uVar158 & (byte)uVar18;
    fVar163 = auVar85._0_4_ * 4.7683716e-07;
    local_610 = ZEXT416((uint)fVar163);
    auVar99._8_4_ = 2;
    auVar99._0_8_ = 0x200000002;
    auVar99._12_4_ = 2;
    auVar99._16_4_ = 2;
    auVar99._20_4_ = 2;
    auVar99._24_4_ = 2;
    auVar99._28_4_ = 2;
    auVar96 = vpermps_avx512vl(auVar99,ZEXT1632(auVar77));
    local_240 = vpermps_avx2(auVar99,ZEXT1632(auVar17));
    local_260 = vpermps_avx2(auVar99,ZEXT1632(auVar83));
    local_280 = vpermps_avx2(auVar99,ZEXT1632(auVar84));
    uVar63 = *(uint *)(ray + k * 4 + 0x60);
    local_620 = ZEXT416(uVar63);
    local_2a0 = vpbroadcastd_avx512vl();
    local_2c0 = vpbroadcastd_avx512vl();
    local_660 = auVar79._0_8_;
    uStack_658 = auVar79._8_8_;
    local_670 = auVar75._0_8_;
    uStack_668 = auVar75._8_8_;
    local_680._0_4_ = auVar89._0_4_;
    fVar155 = (float)local_680;
    local_680._4_4_ = auVar89._4_4_;
    fVar156 = local_680._4_4_;
    uStack_678._0_4_ = auVar89._8_4_;
    fVar157 = (float)uStack_678;
    uStack_678._4_4_ = auVar89._12_4_;
    fVar59 = uStack_678._4_4_;
    local_680 = auVar89._0_8_;
    uStack_678 = auVar89._8_8_;
    if (bVar71 != 0) {
      auVar100 = vmulps_avx512vl(local_280,auVar100);
      auVar101 = vfmadd213ps_avx512vl(auVar101,local_260,auVar100);
      auVar91 = vfmadd213ps_avx512vl(auVar91,local_240,auVar101);
      auVar99 = vfmadd213ps_avx512vl(auVar90,auVar96,auVar91);
      auVar102 = vmulps_avx512vl(local_280,auVar102);
      auVar103 = vfmadd213ps_avx512vl(auVar103,local_260,auVar102);
      auVar91 = vfmadd213ps_avx512vl(auVar106,local_240,auVar103);
      auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar69 + 0x1210);
      auVar103 = *(undefined1 (*) [32])(bspline_basis0 + lVar69 + 0x1694);
      auVar102 = *(undefined1 (*) [32])(bspline_basis0 + lVar69 + 0x1b18);
      auVar90 = *(undefined1 (*) [32])(bspline_basis0 + lVar69 + 0x1f9c);
      auVar104 = vfmadd213ps_avx512vl(auVar105,auVar96,auVar91);
      auVar214._0_4_ = fVar210 * auVar90._0_4_;
      auVar214._4_4_ = fVar210 * auVar90._4_4_;
      auVar214._8_4_ = fVar210 * auVar90._8_4_;
      auVar214._12_4_ = fVar210 * auVar90._12_4_;
      auVar214._16_4_ = fVar210 * auVar90._16_4_;
      auVar214._20_4_ = fVar210 * auVar90._20_4_;
      auVar214._24_4_ = fVar210 * auVar90._24_4_;
      auVar214._28_4_ = 0;
      auVar105 = vmulps_avx512vl(_local_500,auVar90);
      auVar90 = vmulps_avx512vl(local_280,auVar90);
      auVar91 = vfmadd231ps_avx512vl(auVar214,auVar102,local_4a0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,local_4c0);
      auVar102 = vfmadd231ps_avx512vl(auVar90,local_260,auVar102);
      auVar90 = vfmadd231ps_avx512vl(auVar91,auVar103,local_460);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,local_480);
      auVar91 = vfmadd231ps_avx512vl(auVar102,local_240,auVar103);
      auVar89 = vfmadd231ps_fma(auVar90,auVar106,local_420);
      auVar90 = vfmadd231ps_avx512vl(auVar105,auVar106,local_440);
      auVar105 = *(undefined1 (*) [32])(bspline_basis1 + lVar69 + 0x1210);
      auVar103 = *(undefined1 (*) [32])(bspline_basis1 + lVar69 + 0x1b18);
      auVar102 = *(undefined1 (*) [32])(bspline_basis1 + lVar69 + 0x1f9c);
      auVar101 = vfmadd231ps_avx512vl(auVar91,auVar96,auVar106);
      auVar91._4_4_ = fVar210 * auVar102._4_4_;
      auVar91._0_4_ = fVar210 * auVar102._0_4_;
      auVar91._8_4_ = fVar210 * auVar102._8_4_;
      auVar91._12_4_ = fVar210 * auVar102._12_4_;
      auVar91._16_4_ = fVar210 * auVar102._16_4_;
      auVar91._20_4_ = fVar210 * auVar102._20_4_;
      auVar91._24_4_ = fVar210 * auVar102._24_4_;
      auVar91._28_4_ = auVar106._28_4_;
      auVar106 = vmulps_avx512vl(_local_500,auVar102);
      auVar102 = vmulps_avx512vl(local_280,auVar102);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar103,local_4a0);
      auVar100 = vfmadd231ps_avx512vl(auVar106,auVar103,local_4c0);
      auVar224 = ZEXT3264(auVar96);
      auVar103 = vfmadd231ps_avx512vl(auVar102,local_260,auVar103);
      auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar69 + 0x1694);
      auVar102 = vfmadd231ps_avx512vl(auVar91,auVar106,local_460);
      auVar91 = vfmadd231ps_avx512vl(auVar100,auVar106,local_480);
      auVar106 = vfmadd231ps_avx512vl(auVar103,local_240,auVar106);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar225 = ZEXT1664(auVar85);
      auVar85 = vfmadd231ps_fma(auVar102,auVar105,local_420);
      auVar103 = vfmadd231ps_avx512vl(auVar91,auVar105,local_440);
      auVar102 = vfmadd231ps_avx512vl(auVar106,auVar96,auVar105);
      auVar222._8_4_ = 0x7fffffff;
      auVar222._0_8_ = 0x7fffffff7fffffff;
      auVar222._12_4_ = 0x7fffffff;
      auVar222._16_4_ = 0x7fffffff;
      auVar222._20_4_ = 0x7fffffff;
      auVar222._24_4_ = 0x7fffffff;
      auVar222._28_4_ = 0x7fffffff;
      auVar105 = vandps_avx(ZEXT1632(auVar89),auVar222);
      auVar106 = vandps_avx(auVar90,auVar222);
      auVar106 = vmaxps_avx(auVar105,auVar106);
      auVar105 = vandps_avx(auVar101,auVar222);
      auVar105 = vmaxps_avx(auVar106,auVar105);
      auVar218._4_4_ = fVar163;
      auVar218._0_4_ = fVar163;
      auVar218._8_4_ = fVar163;
      auVar218._12_4_ = fVar163;
      auVar218._16_4_ = fVar163;
      auVar218._20_4_ = fVar163;
      auVar218._24_4_ = fVar163;
      auVar218._28_4_ = fVar163;
      uVar62 = vcmpps_avx512vl(auVar105,auVar218,1);
      bVar10 = (bool)((byte)uVar62 & 1);
      auVar107._0_4_ = (float)((uint)bVar10 * auVar94._0_4_ | (uint)!bVar10 * auVar89._0_4_);
      bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * auVar89._4_4_);
      bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * auVar89._8_4_);
      bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * auVar89._12_4_);
      fVar163 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar94._16_4_);
      auVar107._16_4_ = fVar163;
      fVar210 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar94._20_4_);
      auVar107._20_4_ = fVar210;
      fVar211 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar94._24_4_);
      auVar107._24_4_ = fVar211;
      uVar64 = (uint)(byte)(uVar62 >> 7) * auVar94._28_4_;
      auVar107._28_4_ = uVar64;
      bVar10 = (bool)((byte)uVar62 & 1);
      auVar108._0_4_ = (float)((uint)bVar10 * auVar95._0_4_ | (uint)!bVar10 * auVar90._0_4_);
      bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar10 * auVar95._4_4_ | (uint)!bVar10 * auVar90._4_4_);
      bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar10 * auVar95._8_4_ | (uint)!bVar10 * auVar90._8_4_);
      bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar10 * auVar95._12_4_ | (uint)!bVar10 * auVar90._12_4_);
      bVar10 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar108._16_4_ = (float)((uint)bVar10 * auVar95._16_4_ | (uint)!bVar10 * auVar90._16_4_);
      bVar10 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar108._20_4_ = (float)((uint)bVar10 * auVar95._20_4_ | (uint)!bVar10 * auVar90._20_4_);
      bVar10 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar108._24_4_ = (float)((uint)bVar10 * auVar95._24_4_ | (uint)!bVar10 * auVar90._24_4_);
      bVar10 = SUB81(uVar62 >> 7,0);
      auVar108._28_4_ = (uint)bVar10 * auVar95._28_4_ | (uint)!bVar10 * auVar90._28_4_;
      auVar105 = vandps_avx(auVar222,ZEXT1632(auVar85));
      auVar106 = vandps_avx(auVar103,auVar222);
      auVar106 = vmaxps_avx(auVar105,auVar106);
      auVar105 = vandps_avx(auVar102,auVar222);
      auVar105 = vmaxps_avx(auVar106,auVar105);
      uVar62 = vcmpps_avx512vl(auVar105,auVar218,1);
      bVar10 = (bool)((byte)uVar62 & 1);
      auVar109._0_4_ = (float)((uint)bVar10 * auVar94._0_4_ | (uint)!bVar10 * auVar85._0_4_);
      bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * auVar85._4_4_);
      bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * auVar85._8_4_);
      bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * auVar85._12_4_);
      fVar212 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar94._16_4_);
      auVar109._16_4_ = fVar212;
      fVar182 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar94._20_4_);
      auVar109._20_4_ = fVar182;
      fVar173 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar94._24_4_);
      auVar109._24_4_ = fVar173;
      auVar109._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar94._28_4_;
      bVar10 = (bool)((byte)uVar62 & 1);
      auVar110._0_4_ = (float)((uint)bVar10 * auVar95._0_4_ | (uint)!bVar10 * auVar103._0_4_);
      bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar10 * auVar95._4_4_ | (uint)!bVar10 * auVar103._4_4_);
      bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar10 * auVar95._8_4_ | (uint)!bVar10 * auVar103._8_4_);
      bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar10 * auVar95._12_4_ | (uint)!bVar10 * auVar103._12_4_);
      bVar10 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar10 * auVar95._16_4_ | (uint)!bVar10 * auVar103._16_4_);
      bVar10 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar10 * auVar95._20_4_ | (uint)!bVar10 * auVar103._20_4_);
      bVar10 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar10 * auVar95._24_4_ | (uint)!bVar10 * auVar103._24_4_);
      bVar10 = SUB81(uVar62 >> 7,0);
      auVar110._28_4_ = (uint)bVar10 * auVar95._28_4_ | (uint)!bVar10 * auVar103._28_4_;
      auVar87 = vxorps_avx512vl(local_460._0_16_,local_460._0_16_);
      auVar105 = vfmadd213ps_avx512vl(auVar107,auVar107,ZEXT1632(auVar87));
      auVar89 = vfmadd231ps_fma(auVar105,auVar108,auVar108);
      auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
      fVar73 = auVar103._0_4_;
      fVar74 = auVar103._4_4_;
      fVar132 = auVar103._8_4_;
      fVar133 = auVar103._12_4_;
      fVar134 = auVar103._16_4_;
      fVar135 = auVar103._20_4_;
      fVar137 = auVar103._24_4_;
      auVar105._4_4_ = fVar74 * fVar74 * fVar74 * auVar89._4_4_ * -0.5;
      auVar105._0_4_ = fVar73 * fVar73 * fVar73 * auVar89._0_4_ * -0.5;
      auVar105._8_4_ = fVar132 * fVar132 * fVar132 * auVar89._8_4_ * -0.5;
      auVar105._12_4_ = fVar133 * fVar133 * fVar133 * auVar89._12_4_ * -0.5;
      auVar105._16_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar105._20_4_ = fVar135 * fVar135 * fVar135 * -0.0;
      auVar105._24_4_ = fVar137 * fVar137 * fVar137 * -0.0;
      auVar105._28_4_ = 0;
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar90,auVar103);
      auVar106._4_4_ = auVar108._4_4_ * auVar105._4_4_;
      auVar106._0_4_ = auVar108._0_4_ * auVar105._0_4_;
      auVar106._8_4_ = auVar108._8_4_ * auVar105._8_4_;
      auVar106._12_4_ = auVar108._12_4_ * auVar105._12_4_;
      auVar106._16_4_ = auVar108._16_4_ * auVar105._16_4_;
      auVar106._20_4_ = auVar108._20_4_ * auVar105._20_4_;
      auVar106._24_4_ = auVar108._24_4_ * auVar105._24_4_;
      auVar106._28_4_ = auVar103._28_4_;
      auVar103._4_4_ = auVar105._4_4_ * -auVar107._4_4_;
      auVar103._0_4_ = auVar105._0_4_ * -auVar107._0_4_;
      auVar103._8_4_ = auVar105._8_4_ * -auVar107._8_4_;
      auVar103._12_4_ = auVar105._12_4_ * -auVar107._12_4_;
      auVar103._16_4_ = auVar105._16_4_ * -fVar163;
      auVar103._20_4_ = auVar105._20_4_ * -fVar210;
      auVar103._24_4_ = auVar105._24_4_ * -fVar211;
      auVar103._28_4_ = uVar64 ^ 0x80000000;
      auVar91 = vmulps_avx512vl(auVar105,ZEXT1632(auVar87));
      auVar94 = ZEXT1632(auVar87);
      auVar102 = vfmadd213ps_avx512vl(auVar109,auVar109,auVar94);
      auVar89 = vfmadd231ps_fma(auVar102,auVar110,auVar110);
      auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
      fVar163 = auVar100._0_4_;
      fVar210 = auVar100._4_4_;
      fVar211 = auVar100._8_4_;
      fVar73 = auVar100._12_4_;
      fVar74 = auVar100._16_4_;
      fVar132 = auVar100._20_4_;
      fVar133 = auVar100._24_4_;
      auVar102._4_4_ = fVar210 * fVar210 * fVar210 * auVar89._4_4_ * -0.5;
      auVar102._0_4_ = fVar163 * fVar163 * fVar163 * auVar89._0_4_ * -0.5;
      auVar102._8_4_ = fVar211 * fVar211 * fVar211 * auVar89._8_4_ * -0.5;
      auVar102._12_4_ = fVar73 * fVar73 * fVar73 * auVar89._12_4_ * -0.5;
      auVar102._16_4_ = fVar74 * fVar74 * fVar74 * -0.0;
      auVar102._20_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar102._24_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar102._28_4_ = 0;
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar90,auVar100);
      auVar101._4_4_ = auVar110._4_4_ * auVar102._4_4_;
      auVar101._0_4_ = auVar110._0_4_ * auVar102._0_4_;
      auVar101._8_4_ = auVar110._8_4_ * auVar102._8_4_;
      auVar101._12_4_ = auVar110._12_4_ * auVar102._12_4_;
      auVar101._16_4_ = auVar110._16_4_ * auVar102._16_4_;
      auVar101._20_4_ = auVar110._20_4_ * auVar102._20_4_;
      auVar101._24_4_ = auVar110._24_4_ * auVar102._24_4_;
      auVar101._28_4_ = auVar100._28_4_;
      auVar100._4_4_ = -auVar109._4_4_ * auVar102._4_4_;
      auVar100._0_4_ = -auVar109._0_4_ * auVar102._0_4_;
      auVar100._8_4_ = -auVar109._8_4_ * auVar102._8_4_;
      auVar100._12_4_ = -auVar109._12_4_ * auVar102._12_4_;
      auVar100._16_4_ = -fVar212 * auVar102._16_4_;
      auVar100._20_4_ = -fVar182 * auVar102._20_4_;
      auVar100._24_4_ = -fVar173 * auVar102._24_4_;
      auVar100._28_4_ = auVar105._28_4_;
      auVar105 = vmulps_avx512vl(auVar102,auVar94);
      auVar89 = vfmadd213ps_fma(auVar106,auVar97,auVar92);
      auVar85 = vfmadd213ps_fma(auVar103,auVar97,auVar93);
      auVar102 = vfmadd213ps_avx512vl(auVar91,auVar97,auVar104);
      auVar90 = vfmadd213ps_avx512vl(auVar101,ZEXT1632(auVar81),ZEXT1632(auVar80));
      auVar17 = vfnmadd213ps_fma(auVar106,auVar97,auVar92);
      auVar92 = ZEXT1632(auVar81);
      auVar76 = vfmadd213ps_fma(auVar100,auVar92,ZEXT1632(auVar82));
      auVar86 = vfnmadd213ps_fma(auVar103,auVar97,auVar93);
      auVar84 = vfmadd213ps_fma(auVar105,auVar92,auVar99);
      auVar106 = vfnmadd231ps_avx512vl(auVar104,auVar97,auVar91);
      auVar80 = vfnmadd213ps_fma(auVar101,auVar92,ZEXT1632(auVar80));
      auVar82 = vfnmadd213ps_fma(auVar100,auVar92,ZEXT1632(auVar82));
      auVar142 = vfnmadd231ps_fma(auVar99,ZEXT1632(auVar81),auVar105);
      auVar103 = vsubps_avx512vl(auVar90,ZEXT1632(auVar17));
      auVar105 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar86));
      auVar91 = vsubps_avx512vl(ZEXT1632(auVar84),auVar106);
      auVar101 = vmulps_avx512vl(auVar105,auVar106);
      auVar83 = vfmsub231ps_fma(auVar101,ZEXT1632(auVar86),auVar91);
      auVar92._4_4_ = auVar17._4_4_ * auVar91._4_4_;
      auVar92._0_4_ = auVar17._0_4_ * auVar91._0_4_;
      auVar92._8_4_ = auVar17._8_4_ * auVar91._8_4_;
      auVar92._12_4_ = auVar17._12_4_ * auVar91._12_4_;
      auVar92._16_4_ = auVar91._16_4_ * 0.0;
      auVar92._20_4_ = auVar91._20_4_ * 0.0;
      auVar92._24_4_ = auVar91._24_4_ * 0.0;
      auVar92._28_4_ = auVar91._28_4_;
      auVar91 = vfmsub231ps_avx512vl(auVar92,auVar106,auVar103);
      auVar93._4_4_ = auVar86._4_4_ * auVar103._4_4_;
      auVar93._0_4_ = auVar86._0_4_ * auVar103._0_4_;
      auVar93._8_4_ = auVar86._8_4_ * auVar103._8_4_;
      auVar93._12_4_ = auVar86._12_4_ * auVar103._12_4_;
      auVar93._16_4_ = auVar103._16_4_ * 0.0;
      auVar93._20_4_ = auVar103._20_4_ * 0.0;
      auVar93._24_4_ = auVar103._24_4_ * 0.0;
      auVar93._28_4_ = auVar103._28_4_;
      auVar77 = vfmsub231ps_fma(auVar93,ZEXT1632(auVar17),auVar105);
      auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar94,auVar91);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar94,ZEXT1632(auVar83));
      auVar99 = ZEXT1632(auVar87);
      uVar62 = vcmpps_avx512vl(auVar105,auVar99,2);
      bVar60 = (byte)uVar62;
      fVar73 = (float)((uint)(bVar60 & 1) * auVar89._0_4_ |
                      (uint)!(bool)(bVar60 & 1) * auVar80._0_4_);
      bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
      fVar132 = (float)((uint)bVar10 * auVar89._4_4_ | (uint)!bVar10 * auVar80._4_4_);
      bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
      fVar134 = (float)((uint)bVar10 * auVar89._8_4_ | (uint)!bVar10 * auVar80._8_4_);
      bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
      fVar137 = (float)((uint)bVar10 * auVar89._12_4_ | (uint)!bVar10 * auVar80._12_4_);
      auVar101 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar134,CONCAT44(fVar132,fVar73))));
      fVar74 = (float)((uint)(bVar60 & 1) * auVar85._0_4_ |
                      (uint)!(bool)(bVar60 & 1) * auVar82._0_4_);
      bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
      fVar133 = (float)((uint)bVar10 * auVar85._4_4_ | (uint)!bVar10 * auVar82._4_4_);
      bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
      fVar135 = (float)((uint)bVar10 * auVar85._8_4_ | (uint)!bVar10 * auVar82._8_4_);
      bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
      fVar138 = (float)((uint)bVar10 * auVar85._12_4_ | (uint)!bVar10 * auVar82._12_4_);
      auVar100 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(fVar133,fVar74))));
      auVar111._0_4_ =
           (float)((uint)(bVar60 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar142._0_4_)
      ;
      bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar10 * auVar102._4_4_ | (uint)!bVar10 * auVar142._4_4_);
      bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar10 * auVar102._8_4_ | (uint)!bVar10 * auVar142._8_4_);
      bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar10 * auVar102._12_4_ | (uint)!bVar10 * auVar142._12_4_);
      fVar163 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar102._16_4_);
      auVar111._16_4_ = fVar163;
      fVar210 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar102._20_4_);
      auVar111._20_4_ = fVar210;
      fVar211 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar102._24_4_);
      auVar111._24_4_ = fVar211;
      iVar1 = (uint)(byte)(uVar62 >> 7) * auVar102._28_4_;
      auVar111._28_4_ = iVar1;
      auVar103 = vblendmps_avx512vl(ZEXT1632(auVar17),auVar90);
      auVar112._0_4_ =
           (uint)(bVar60 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar85._0_4_;
      bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar10 * auVar103._4_4_ | (uint)!bVar10 * auVar85._4_4_;
      bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar10 * auVar103._8_4_ | (uint)!bVar10 * auVar85._8_4_;
      bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar10 * auVar103._12_4_ | (uint)!bVar10 * auVar85._12_4_;
      auVar112._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar103._16_4_;
      auVar112._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar103._20_4_;
      auVar112._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar103._24_4_;
      auVar112._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar103._28_4_;
      auVar103 = vblendmps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar76));
      auVar113._0_4_ =
           (float)((uint)(bVar60 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar83._0_4_);
      bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar10 * auVar103._4_4_ | (uint)!bVar10 * auVar83._4_4_);
      bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar10 * auVar103._8_4_ | (uint)!bVar10 * auVar83._8_4_);
      bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar10 * auVar103._12_4_ | (uint)!bVar10 * auVar83._12_4_);
      fVar212 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar103._16_4_);
      auVar113._16_4_ = fVar212;
      fVar173 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar103._20_4_);
      auVar113._20_4_ = fVar173;
      fVar182 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar103._24_4_);
      auVar113._24_4_ = fVar182;
      auVar113._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar103._28_4_;
      auVar103 = vblendmps_avx512vl(auVar106,ZEXT1632(auVar84));
      auVar114._0_4_ =
           (float)((uint)(bVar60 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar102._0_4_)
      ;
      bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar10 * auVar103._4_4_ | (uint)!bVar10 * auVar102._4_4_);
      bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar10 * auVar103._8_4_ | (uint)!bVar10 * auVar102._8_4_);
      bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar10 * auVar103._12_4_ | (uint)!bVar10 * auVar102._12_4_);
      bVar10 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar114._16_4_ = (float)((uint)bVar10 * auVar103._16_4_ | (uint)!bVar10 * auVar102._16_4_);
      bVar10 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar114._20_4_ = (float)((uint)bVar10 * auVar103._20_4_ | (uint)!bVar10 * auVar102._20_4_);
      bVar10 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar114._24_4_ = (float)((uint)bVar10 * auVar103._24_4_ | (uint)!bVar10 * auVar102._24_4_);
      bVar10 = SUB81(uVar62 >> 7,0);
      auVar114._28_4_ = (uint)bVar10 * auVar103._28_4_ | (uint)!bVar10 * auVar102._28_4_;
      auVar115._0_4_ =
           (uint)(bVar60 & 1) * (int)auVar17._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar90._0_4_;
      bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar10 * (int)auVar17._4_4_ | (uint)!bVar10 * auVar90._4_4_;
      bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar10 * (int)auVar17._8_4_ | (uint)!bVar10 * auVar90._8_4_;
      bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar10 * (int)auVar17._12_4_ | (uint)!bVar10 * auVar90._12_4_;
      auVar115._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar90._16_4_;
      auVar115._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar90._20_4_;
      auVar115._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar90._24_4_;
      auVar115._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar90._28_4_;
      bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
      bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar116._0_4_ =
           (uint)(bVar60 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar84._0_4_;
      bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar11 * auVar106._4_4_ | (uint)!bVar11 * auVar84._4_4_;
      bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar11 * auVar106._8_4_ | (uint)!bVar11 * auVar84._8_4_;
      bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar11 * auVar106._12_4_ | (uint)!bVar11 * auVar84._12_4_;
      auVar116._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar106._16_4_;
      auVar116._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar106._20_4_;
      auVar116._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar106._24_4_;
      iVar2 = (uint)(byte)(uVar62 >> 7) * auVar106._28_4_;
      auVar116._28_4_ = iVar2;
      auVar92 = vsubps_avx512vl(auVar115,auVar101);
      auVar106 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar13 * (int)auVar86._12_4_ |
                                               (uint)!bVar13 * auVar76._12_4_,
                                               CONCAT48((uint)bVar12 * (int)auVar86._8_4_ |
                                                        (uint)!bVar12 * auVar76._8_4_,
                                                        CONCAT44((uint)bVar10 * (int)auVar86._4_4_ |
                                                                 (uint)!bVar10 * auVar76._4_4_,
                                                                 (uint)(bVar60 & 1) *
                                                                 (int)auVar86._0_4_ |
                                                                 (uint)!(bool)(bVar60 & 1) *
                                                                 auVar76._0_4_)))),auVar100);
      auVar205 = ZEXT3264(auVar106);
      auVar103 = vsubps_avx(auVar116,auVar111);
      auVar102 = vsubps_avx(auVar101,auVar112);
      auVar208 = ZEXT3264(auVar102);
      auVar90 = vsubps_avx(auVar100,auVar113);
      auVar91 = vsubps_avx(auVar111,auVar114);
      auVar94._4_4_ = auVar103._4_4_ * fVar132;
      auVar94._0_4_ = auVar103._0_4_ * fVar73;
      auVar94._8_4_ = auVar103._8_4_ * fVar134;
      auVar94._12_4_ = auVar103._12_4_ * fVar137;
      auVar94._16_4_ = auVar103._16_4_ * 0.0;
      auVar94._20_4_ = auVar103._20_4_ * 0.0;
      auVar94._24_4_ = auVar103._24_4_ * 0.0;
      auVar94._28_4_ = iVar2;
      auVar89 = vfmsub231ps_fma(auVar94,auVar111,auVar92);
      auVar95._4_4_ = fVar133 * auVar92._4_4_;
      auVar95._0_4_ = fVar74 * auVar92._0_4_;
      auVar95._8_4_ = fVar135 * auVar92._8_4_;
      auVar95._12_4_ = fVar138 * auVar92._12_4_;
      auVar95._16_4_ = auVar92._16_4_ * 0.0;
      auVar95._20_4_ = auVar92._20_4_ * 0.0;
      auVar95._24_4_ = auVar92._24_4_ * 0.0;
      auVar95._28_4_ = auVar105._28_4_;
      auVar85 = vfmsub231ps_fma(auVar95,auVar101,auVar106);
      auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar99,ZEXT1632(auVar89));
      auVar191._0_4_ = auVar106._0_4_ * auVar111._0_4_;
      auVar191._4_4_ = auVar106._4_4_ * auVar111._4_4_;
      auVar191._8_4_ = auVar106._8_4_ * auVar111._8_4_;
      auVar191._12_4_ = auVar106._12_4_ * auVar111._12_4_;
      auVar191._16_4_ = auVar106._16_4_ * fVar163;
      auVar191._20_4_ = auVar106._20_4_ * fVar210;
      auVar191._24_4_ = auVar106._24_4_ * fVar211;
      auVar191._28_4_ = 0;
      auVar89 = vfmsub231ps_fma(auVar191,auVar100,auVar103);
      auVar93 = vfmadd231ps_avx512vl(auVar105,auVar99,ZEXT1632(auVar89));
      auVar105 = vmulps_avx512vl(auVar91,auVar112);
      auVar105 = vfmsub231ps_avx512vl(auVar105,auVar102,auVar114);
      auVar104._4_4_ = auVar90._4_4_ * auVar114._4_4_;
      auVar104._0_4_ = auVar90._0_4_ * auVar114._0_4_;
      auVar104._8_4_ = auVar90._8_4_ * auVar114._8_4_;
      auVar104._12_4_ = auVar90._12_4_ * auVar114._12_4_;
      auVar104._16_4_ = auVar90._16_4_ * auVar114._16_4_;
      auVar104._20_4_ = auVar90._20_4_ * auVar114._20_4_;
      auVar104._24_4_ = auVar90._24_4_ * auVar114._24_4_;
      auVar104._28_4_ = auVar114._28_4_;
      auVar89 = vfmsub231ps_fma(auVar104,auVar113,auVar91);
      auVar192._0_4_ = auVar113._0_4_ * auVar102._0_4_;
      auVar192._4_4_ = auVar113._4_4_ * auVar102._4_4_;
      auVar192._8_4_ = auVar113._8_4_ * auVar102._8_4_;
      auVar192._12_4_ = auVar113._12_4_ * auVar102._12_4_;
      auVar192._16_4_ = fVar212 * auVar102._16_4_;
      auVar192._20_4_ = fVar173 * auVar102._20_4_;
      auVar192._24_4_ = fVar182 * auVar102._24_4_;
      auVar192._28_4_ = 0;
      auVar85 = vfmsub231ps_fma(auVar192,auVar90,auVar112);
      auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar99,auVar105);
      auVar94 = vfmadd231ps_avx512vl(auVar105,auVar99,ZEXT1632(auVar89));
      auVar196 = ZEXT3264(auVar94);
      auVar105 = vmaxps_avx(auVar93,auVar94);
      uVar158 = vcmpps_avx512vl(auVar105,auVar99,2);
      bVar71 = bVar71 & (byte)uVar158;
      if (bVar71 != 0) {
        auVar31._4_4_ = auVar91._4_4_ * auVar106._4_4_;
        auVar31._0_4_ = auVar91._0_4_ * auVar106._0_4_;
        auVar31._8_4_ = auVar91._8_4_ * auVar106._8_4_;
        auVar31._12_4_ = auVar91._12_4_ * auVar106._12_4_;
        auVar31._16_4_ = auVar91._16_4_ * auVar106._16_4_;
        auVar31._20_4_ = auVar91._20_4_ * auVar106._20_4_;
        auVar31._24_4_ = auVar91._24_4_ * auVar106._24_4_;
        auVar31._28_4_ = auVar105._28_4_;
        auVar84 = vfmsub231ps_fma(auVar31,auVar90,auVar103);
        auVar32._4_4_ = auVar103._4_4_ * auVar102._4_4_;
        auVar32._0_4_ = auVar103._0_4_ * auVar102._0_4_;
        auVar32._8_4_ = auVar103._8_4_ * auVar102._8_4_;
        auVar32._12_4_ = auVar103._12_4_ * auVar102._12_4_;
        auVar32._16_4_ = auVar103._16_4_ * auVar102._16_4_;
        auVar32._20_4_ = auVar103._20_4_ * auVar102._20_4_;
        auVar32._24_4_ = auVar103._24_4_ * auVar102._24_4_;
        auVar32._28_4_ = auVar103._28_4_;
        auVar76 = vfmsub231ps_fma(auVar32,auVar92,auVar91);
        auVar33._4_4_ = auVar90._4_4_ * auVar92._4_4_;
        auVar33._0_4_ = auVar90._0_4_ * auVar92._0_4_;
        auVar33._8_4_ = auVar90._8_4_ * auVar92._8_4_;
        auVar33._12_4_ = auVar90._12_4_ * auVar92._12_4_;
        auVar33._16_4_ = auVar90._16_4_ * auVar92._16_4_;
        auVar33._20_4_ = auVar90._20_4_ * auVar92._20_4_;
        auVar33._24_4_ = auVar90._24_4_ * auVar92._24_4_;
        auVar33._28_4_ = auVar90._28_4_;
        auVar83 = vfmsub231ps_fma(auVar33,auVar102,auVar106);
        auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar76),ZEXT1632(auVar83));
        auVar85 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar84),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar105 = vrcp14ps_avx512vl(ZEXT1632(auVar85));
        auVar208 = ZEXT3264(auVar105);
        auVar24._8_4_ = 0x3f800000;
        auVar24._0_8_ = 0x3f8000003f800000;
        auVar24._12_4_ = 0x3f800000;
        auVar24._16_4_ = 0x3f800000;
        auVar24._20_4_ = 0x3f800000;
        auVar24._24_4_ = 0x3f800000;
        auVar24._28_4_ = 0x3f800000;
        auVar106 = vfnmadd213ps_avx512vl(auVar105,ZEXT1632(auVar85),auVar24);
        auVar89 = vfmadd132ps_fma(auVar106,auVar105,auVar105);
        auVar205 = ZEXT1664(auVar89);
        auVar34._4_4_ = auVar83._4_4_ * auVar111._4_4_;
        auVar34._0_4_ = auVar83._0_4_ * auVar111._0_4_;
        auVar34._8_4_ = auVar83._8_4_ * auVar111._8_4_;
        auVar34._12_4_ = auVar83._12_4_ * auVar111._12_4_;
        auVar34._16_4_ = fVar163 * 0.0;
        auVar34._20_4_ = fVar210 * 0.0;
        auVar34._24_4_ = fVar211 * 0.0;
        auVar34._28_4_ = iVar1;
        auVar76 = vfmadd231ps_fma(auVar34,auVar100,ZEXT1632(auVar76));
        auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar101,ZEXT1632(auVar84));
        fVar163 = auVar89._0_4_;
        fVar210 = auVar89._4_4_;
        fVar211 = auVar89._8_4_;
        fVar212 = auVar89._12_4_;
        local_540 = ZEXT1632(CONCAT412(auVar76._12_4_ * fVar212,
                                       CONCAT48(auVar76._8_4_ * fVar211,
                                                CONCAT44(auVar76._4_4_ * fVar210,
                                                         auVar76._0_4_ * fVar163))));
        auVar216 = ZEXT3264(local_540);
        auVar147._4_4_ = uVar63;
        auVar147._0_4_ = uVar63;
        auVar147._8_4_ = uVar63;
        auVar147._12_4_ = uVar63;
        auVar147._16_4_ = uVar63;
        auVar147._20_4_ = uVar63;
        auVar147._24_4_ = uVar63;
        auVar147._28_4_ = uVar63;
        uVar158 = vcmpps_avx512vl(auVar147,local_540,2);
        uVar141 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar25._4_4_ = uVar141;
        auVar25._0_4_ = uVar141;
        auVar25._8_4_ = uVar141;
        auVar25._12_4_ = uVar141;
        auVar25._16_4_ = uVar141;
        auVar25._20_4_ = uVar141;
        auVar25._24_4_ = uVar141;
        auVar25._28_4_ = uVar141;
        uVar18 = vcmpps_avx512vl(local_540,auVar25,2);
        bVar71 = (byte)uVar158 & (byte)uVar18 & bVar71;
        if (bVar71 != 0) {
          uVar72 = vcmpps_avx512vl(ZEXT1632(auVar85),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar72 = bVar71 & uVar72;
          if ((char)uVar72 != '\0') {
            fVar173 = auVar93._0_4_ * fVar163;
            fVar182 = auVar93._4_4_ * fVar210;
            auVar35._4_4_ = fVar182;
            auVar35._0_4_ = fVar173;
            fVar73 = auVar93._8_4_ * fVar211;
            auVar35._8_4_ = fVar73;
            fVar74 = auVar93._12_4_ * fVar212;
            auVar35._12_4_ = fVar74;
            fVar132 = auVar93._16_4_ * 0.0;
            auVar35._16_4_ = fVar132;
            fVar133 = auVar93._20_4_ * 0.0;
            auVar35._20_4_ = fVar133;
            fVar134 = auVar93._24_4_ * 0.0;
            auVar35._24_4_ = fVar134;
            auVar35._28_4_ = auVar93._28_4_;
            auVar148._8_4_ = 0x3f800000;
            auVar148._0_8_ = 0x3f8000003f800000;
            auVar148._12_4_ = 0x3f800000;
            auVar148._16_4_ = 0x3f800000;
            auVar148._20_4_ = 0x3f800000;
            auVar148._24_4_ = 0x3f800000;
            auVar148._28_4_ = 0x3f800000;
            auVar105 = vsubps_avx(auVar148,auVar35);
            local_400._0_4_ =
                 (uint)(bVar60 & 1) * (int)fVar173 | (uint)!(bool)(bVar60 & 1) * auVar105._0_4_;
            bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
            local_400._4_4_ = (uint)bVar10 * (int)fVar182 | (uint)!bVar10 * auVar105._4_4_;
            bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
            local_400._8_4_ = (uint)bVar10 * (int)fVar73 | (uint)!bVar10 * auVar105._8_4_;
            bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
            local_400._12_4_ = (uint)bVar10 * (int)fVar74 | (uint)!bVar10 * auVar105._12_4_;
            bVar10 = (bool)((byte)(uVar62 >> 4) & 1);
            local_400._16_4_ = (uint)bVar10 * (int)fVar132 | (uint)!bVar10 * auVar105._16_4_;
            bVar10 = (bool)((byte)(uVar62 >> 5) & 1);
            local_400._20_4_ = (uint)bVar10 * (int)fVar133 | (uint)!bVar10 * auVar105._20_4_;
            bVar10 = (bool)((byte)(uVar62 >> 6) & 1);
            local_400._24_4_ = (uint)bVar10 * (int)fVar134 | (uint)!bVar10 * auVar105._24_4_;
            bVar10 = SUB81(uVar62 >> 7,0);
            local_400._28_4_ = (uint)bVar10 * auVar93._28_4_ | (uint)!bVar10 * auVar105._28_4_;
            auVar105 = vsubps_avx(ZEXT1632(auVar81),auVar97);
            auVar89 = vfmadd213ps_fma(auVar105,local_400,auVar97);
            uVar141 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar97._4_4_ = uVar141;
            auVar97._0_4_ = uVar141;
            auVar97._8_4_ = uVar141;
            auVar97._12_4_ = uVar141;
            auVar97._16_4_ = uVar141;
            auVar97._20_4_ = uVar141;
            auVar97._24_4_ = uVar141;
            auVar97._28_4_ = uVar141;
            auVar105 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                          CONCAT48(auVar89._8_4_ + auVar89._8_4_,
                                                                   CONCAT44(auVar89._4_4_ +
                                                                            auVar89._4_4_,
                                                                            auVar89._0_4_ +
                                                                            auVar89._0_4_)))),
                                       auVar97);
            uVar65 = vcmpps_avx512vl(local_540,auVar105,6);
            uVar72 = uVar72 & uVar65;
            bVar71 = (byte)uVar72;
            if (bVar71 != 0) {
              auVar171._0_4_ = auVar94._0_4_ * fVar163;
              auVar171._4_4_ = auVar94._4_4_ * fVar210;
              auVar171._8_4_ = auVar94._8_4_ * fVar211;
              auVar171._12_4_ = auVar94._12_4_ * fVar212;
              auVar171._16_4_ = auVar94._16_4_ * 0.0;
              auVar171._20_4_ = auVar94._20_4_ * 0.0;
              auVar171._24_4_ = auVar94._24_4_ * 0.0;
              auVar171._28_4_ = 0;
              auVar179._8_4_ = 0x3f800000;
              auVar179._0_8_ = 0x3f8000003f800000;
              auVar179._12_4_ = 0x3f800000;
              auVar179._16_4_ = 0x3f800000;
              auVar179._20_4_ = 0x3f800000;
              auVar179._24_4_ = 0x3f800000;
              auVar179._28_4_ = 0x3f800000;
              auVar105 = vsubps_avx(auVar179,auVar171);
              auVar117._0_4_ =
                   (uint)(bVar60 & 1) * (int)auVar171._0_4_ |
                   (uint)!(bool)(bVar60 & 1) * auVar105._0_4_;
              bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
              auVar117._4_4_ = (uint)bVar10 * (int)auVar171._4_4_ | (uint)!bVar10 * auVar105._4_4_;
              bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
              auVar117._8_4_ = (uint)bVar10 * (int)auVar171._8_4_ | (uint)!bVar10 * auVar105._8_4_;
              bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
              auVar117._12_4_ =
                   (uint)bVar10 * (int)auVar171._12_4_ | (uint)!bVar10 * auVar105._12_4_;
              bVar10 = (bool)((byte)(uVar62 >> 4) & 1);
              auVar117._16_4_ =
                   (uint)bVar10 * (int)auVar171._16_4_ | (uint)!bVar10 * auVar105._16_4_;
              bVar10 = (bool)((byte)(uVar62 >> 5) & 1);
              auVar117._20_4_ =
                   (uint)bVar10 * (int)auVar171._20_4_ | (uint)!bVar10 * auVar105._20_4_;
              bVar10 = (bool)((byte)(uVar62 >> 6) & 1);
              auVar117._24_4_ =
                   (uint)bVar10 * (int)auVar171._24_4_ | (uint)!bVar10 * auVar105._24_4_;
              auVar117._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar105._28_4_;
              auVar26._8_4_ = 0x40000000;
              auVar26._0_8_ = 0x4000000040000000;
              auVar26._12_4_ = 0x40000000;
              auVar26._16_4_ = 0x40000000;
              auVar26._20_4_ = 0x40000000;
              auVar26._24_4_ = 0x40000000;
              auVar26._28_4_ = 0x40000000;
              local_3e0 = vfmsub132ps_avx512vl(auVar117,auVar179,auVar26);
              local_3a0 = 0;
              local_380 = local_660;
              uStack_378 = uStack_658;
              local_370 = local_670;
              uStack_368 = uStack_668;
              local_360 = local_680;
              uStack_358 = uStack_678;
              if ((pGVar67->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                auVar105 = vaddps_avx512vl(local_400,auVar227._0_32_);
                fVar163 = 1.0 / auVar98._0_4_;
                local_340[0] = fVar163 * auVar105._0_4_;
                local_340[1] = fVar163 * auVar105._4_4_;
                local_340[2] = fVar163 * auVar105._8_4_;
                local_340[3] = fVar163 * auVar105._12_4_;
                fStack_330 = fVar163 * auVar105._16_4_;
                fStack_32c = fVar163 * auVar105._20_4_;
                fStack_328 = fVar163 * auVar105._24_4_;
                fStack_324 = (float)auVar105._28_4_;
                local_320 = local_3e0;
                local_300 = local_540;
                auVar149._8_4_ = 0x7f800000;
                auVar149._0_8_ = 0x7f8000007f800000;
                auVar149._12_4_ = 0x7f800000;
                auVar149._16_4_ = 0x7f800000;
                auVar149._20_4_ = 0x7f800000;
                auVar149._24_4_ = 0x7f800000;
                auVar149._28_4_ = 0x7f800000;
                auVar105 = vblendmps_avx512vl(auVar149,local_540);
                auVar118._0_4_ =
                     (uint)(bVar71 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar71 & 1) * 0x7f800000;
                bVar10 = (bool)((byte)(uVar72 >> 1) & 1);
                auVar118._4_4_ = (uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar72 >> 2) & 1);
                auVar118._8_4_ = (uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar72 >> 3) & 1);
                auVar118._12_4_ = (uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar72 >> 4) & 1);
                auVar118._16_4_ = (uint)bVar10 * auVar105._16_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar72 >> 5) & 1);
                auVar118._20_4_ = (uint)bVar10 * auVar105._20_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar72 >> 6) & 1);
                auVar118._24_4_ = (uint)bVar10 * auVar105._24_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = SUB81(uVar72 >> 7,0);
                auVar118._28_4_ = (uint)bVar10 * auVar105._28_4_ | (uint)!bVar10 * 0x7f800000;
                auVar105 = vshufps_avx(auVar118,auVar118,0xb1);
                auVar105 = vminps_avx(auVar118,auVar105);
                auVar106 = vshufpd_avx(auVar105,auVar105,5);
                auVar105 = vminps_avx(auVar105,auVar106);
                auVar106 = vpermpd_avx2(auVar105,0x4e);
                auVar105 = vminps_avx(auVar105,auVar106);
                uVar158 = vcmpps_avx512vl(auVar118,auVar105,0);
                uVar63 = (uint)uVar72;
                if ((bVar71 & (byte)uVar158) != 0) {
                  uVar63 = (uint)(bVar71 & (byte)uVar158);
                }
                uVar64 = 0;
                for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
                  uVar64 = uVar64 + 1;
                }
                uVar62 = (ulong)uVar64;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar67->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_520 = *(undefined4 *)(ray + k * 4 + 0x100);
                  uStack_51c = 0;
                  uStack_518 = 0;
                  uStack_514 = 0;
                  local_580 = auVar96;
                  local_3c0 = local_540;
                  local_39c = iVar7;
                  local_390 = auVar78;
                  do {
                    fVar163 = local_340[uVar62];
                    auVar161._4_4_ = fVar163;
                    auVar161._0_4_ = fVar163;
                    auVar161._8_4_ = fVar163;
                    auVar161._12_4_ = fVar163;
                    local_1c0._16_4_ = fVar163;
                    local_1c0._0_16_ = auVar161;
                    local_1c0._20_4_ = fVar163;
                    local_1c0._24_4_ = fVar163;
                    local_1c0._28_4_ = fVar163;
                    local_1a0 = *(undefined4 *)(local_320 + uVar62 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar62 * 4);
                    local_650.context = context->user;
                    fVar210 = 1.0 - fVar163;
                    auVar23._8_4_ = 0x80000000;
                    auVar23._0_8_ = 0x8000000080000000;
                    auVar23._12_4_ = 0x80000000;
                    auVar76 = vxorps_avx512vl(ZEXT416((uint)fVar210),auVar23);
                    auVar89 = ZEXT416((uint)(fVar163 * fVar210 * 4.0));
                    auVar85 = vfnmsub213ss_fma(auVar161,auVar161,auVar89);
                    auVar89 = vfmadd213ss_fma(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),auVar89)
                    ;
                    auVar208 = ZEXT464(0x3f000000);
                    fVar210 = fVar210 * auVar76._0_4_ * 0.5;
                    fVar211 = auVar85._0_4_ * 0.5;
                    fVar212 = auVar89._0_4_ * 0.5;
                    fVar163 = fVar163 * fVar163 * 0.5;
                    auVar201._0_4_ = fVar163 * fVar155;
                    auVar201._4_4_ = fVar163 * fVar156;
                    auVar201._8_4_ = fVar163 * fVar157;
                    auVar201._12_4_ = fVar163 * fVar59;
                    auVar145._4_4_ = fVar212;
                    auVar145._0_4_ = fVar212;
                    auVar145._8_4_ = fVar212;
                    auVar145._12_4_ = fVar212;
                    auVar89 = vfmadd132ps_fma(auVar145,auVar201,auVar75);
                    auVar190._4_4_ = fVar211;
                    auVar190._0_4_ = fVar211;
                    auVar190._8_4_ = fVar211;
                    auVar190._12_4_ = fVar211;
                    auVar89 = vfmadd132ps_fma(auVar190,auVar89,auVar79);
                    auVar146._4_4_ = fVar210;
                    auVar146._0_4_ = fVar210;
                    auVar146._8_4_ = fVar210;
                    auVar146._12_4_ = fVar210;
                    auVar89 = vfmadd213ps_fma(auVar146,auVar78,auVar89);
                    local_220 = auVar89._0_4_;
                    auVar96._8_4_ = 1;
                    auVar96._0_8_ = 0x100000001;
                    auVar96._12_4_ = 1;
                    auVar96._16_4_ = 1;
                    auVar96._20_4_ = 1;
                    auVar96._24_4_ = 1;
                    auVar96._28_4_ = 1;
                    local_200 = vpermps_avx2(auVar96,ZEXT1632(auVar89));
                    auVar196 = ZEXT3264(local_200);
                    auVar202._8_4_ = 2;
                    auVar202._0_8_ = 0x200000002;
                    auVar202._12_4_ = 2;
                    auVar204._16_4_ = 2;
                    auVar204._0_16_ = auVar202;
                    auVar204._20_4_ = 2;
                    auVar204._24_4_ = 2;
                    auVar204._28_4_ = 2;
                    auVar205 = ZEXT3264(auVar204);
                    local_1e0 = vpermps_avx2(auVar204,ZEXT1632(auVar89));
                    iStack_21c = local_220;
                    iStack_218 = local_220;
                    iStack_214 = local_220;
                    iStack_210 = local_220;
                    iStack_20c = local_220;
                    iStack_208 = local_220;
                    iStack_204 = local_220;
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = local_2c0._0_8_;
                    uStack_178 = local_2c0._8_8_;
                    uStack_170 = local_2c0._16_8_;
                    uStack_168 = local_2c0._24_8_;
                    local_160 = local_2a0;
                    auVar105 = vpcmpeqd_avx2(local_2a0,local_2a0);
                    local_5e8[1] = auVar105;
                    *local_5e8 = auVar105;
                    local_140 = (local_650.context)->instID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_120 = (local_650.context)->instPrimID[0];
                    uStack_11c = local_120;
                    uStack_118 = local_120;
                    uStack_114 = local_120;
                    uStack_110 = local_120;
                    uStack_10c = local_120;
                    uStack_108 = local_120;
                    uStack_104 = local_120;
                    local_5c0 = local_2e0;
                    local_650.valid = (int *)local_5c0;
                    local_650.geometryUserPtr = *(void **)(local_5e0._0_8_ + 0x18);
                    local_650.hit = (RTCHitN *)&local_220;
                    local_650.N = 8;
                    local_650.ray = (RTCRayN *)ray;
                    if (*(code **)(local_5e0._0_8_ + 0x40) != (code *)0x0) {
                      auVar196 = ZEXT1664(local_200._0_16_);
                      auVar205 = ZEXT1664(auVar202);
                      auVar208 = ZEXT1664(auVar208._0_16_);
                      (**(code **)(local_5e0._0_8_ + 0x40))(&local_650);
                      auVar216 = ZEXT3264(local_540);
                      auVar224 = ZEXT3264(local_580);
                      auVar227 = ZEXT3264(_DAT_01f7b060);
                      auVar226 = ZEXT1664(local_5a0);
                      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar225 = ZEXT1664(auVar89);
                      ray = local_5f0;
                    }
                    if (local_5c0 == (undefined1  [32])0x0) {
LAB_0179dab4:
                      *(undefined4 *)(ray + k * 4 + 0x100) = local_520;
                    }
                    else {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_5e0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar196 = ZEXT1664(auVar196._0_16_);
                        auVar205 = ZEXT1664(auVar205._0_16_);
                        auVar208 = ZEXT1664(auVar208._0_16_);
                        (*p_Var9)(&local_650);
                        auVar216 = ZEXT3264(local_540);
                        auVar224 = ZEXT3264(local_580);
                        auVar227 = ZEXT3264(_DAT_01f7b060);
                        auVar226 = ZEXT1664(local_5a0);
                        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar225 = ZEXT1664(auVar89);
                        ray = local_5f0;
                      }
                      if (local_5c0 == (undefined1  [32])0x0) goto LAB_0179dab4;
                      uVar65 = vptestmd_avx512vl(local_5c0,local_5c0);
                      iVar1 = *(int *)(local_650.hit + 4);
                      iVar2 = *(int *)(local_650.hit + 8);
                      iVar53 = *(int *)(local_650.hit + 0xc);
                      iVar54 = *(int *)(local_650.hit + 0x10);
                      iVar55 = *(int *)(local_650.hit + 0x14);
                      iVar56 = *(int *)(local_650.hit + 0x18);
                      iVar57 = *(int *)(local_650.hit + 0x1c);
                      bVar71 = (byte)uVar65;
                      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar65 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar65 >> 6) & 1);
                      bVar16 = SUB81(uVar65 >> 7,0);
                      *(uint *)(local_650.ray + 0x180) =
                           (uint)(bVar71 & 1) * *(int *)local_650.hit |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x180);
                      *(uint *)(local_650.ray + 0x184) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_650.ray + 0x184);
                      *(uint *)(local_650.ray + 0x188) =
                           (uint)bVar11 * iVar2 | (uint)!bVar11 * *(int *)(local_650.ray + 0x188);
                      *(uint *)(local_650.ray + 0x18c) =
                           (uint)bVar12 * iVar53 | (uint)!bVar12 * *(int *)(local_650.ray + 0x18c);
                      *(uint *)(local_650.ray + 400) =
                           (uint)bVar13 * iVar54 | (uint)!bVar13 * *(int *)(local_650.ray + 400);
                      *(uint *)(local_650.ray + 0x194) =
                           (uint)bVar14 * iVar55 | (uint)!bVar14 * *(int *)(local_650.ray + 0x194);
                      *(uint *)(local_650.ray + 0x198) =
                           (uint)bVar15 * iVar56 | (uint)!bVar15 * *(int *)(local_650.ray + 0x198);
                      *(uint *)(local_650.ray + 0x19c) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_650.ray + 0x19c);
                      iVar1 = *(int *)(local_650.hit + 0x24);
                      iVar2 = *(int *)(local_650.hit + 0x28);
                      iVar53 = *(int *)(local_650.hit + 0x2c);
                      iVar54 = *(int *)(local_650.hit + 0x30);
                      iVar55 = *(int *)(local_650.hit + 0x34);
                      iVar56 = *(int *)(local_650.hit + 0x38);
                      iVar57 = *(int *)(local_650.hit + 0x3c);
                      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar65 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar65 >> 6) & 1);
                      bVar16 = SUB81(uVar65 >> 7,0);
                      *(uint *)(local_650.ray + 0x1a0) =
                           (uint)(bVar71 & 1) * *(int *)(local_650.hit + 0x20) |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x1a0);
                      *(uint *)(local_650.ray + 0x1a4) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_650.ray + 0x1a4);
                      *(uint *)(local_650.ray + 0x1a8) =
                           (uint)bVar11 * iVar2 | (uint)!bVar11 * *(int *)(local_650.ray + 0x1a8);
                      *(uint *)(local_650.ray + 0x1ac) =
                           (uint)bVar12 * iVar53 | (uint)!bVar12 * *(int *)(local_650.ray + 0x1ac);
                      *(uint *)(local_650.ray + 0x1b0) =
                           (uint)bVar13 * iVar54 | (uint)!bVar13 * *(int *)(local_650.ray + 0x1b0);
                      *(uint *)(local_650.ray + 0x1b4) =
                           (uint)bVar14 * iVar55 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1b4);
                      *(uint *)(local_650.ray + 0x1b8) =
                           (uint)bVar15 * iVar56 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1b8);
                      *(uint *)(local_650.ray + 0x1bc) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1bc);
                      iVar1 = *(int *)(local_650.hit + 0x44);
                      iVar2 = *(int *)(local_650.hit + 0x48);
                      iVar53 = *(int *)(local_650.hit + 0x4c);
                      iVar54 = *(int *)(local_650.hit + 0x50);
                      iVar55 = *(int *)(local_650.hit + 0x54);
                      iVar56 = *(int *)(local_650.hit + 0x58);
                      iVar57 = *(int *)(local_650.hit + 0x5c);
                      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar65 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar65 >> 6) & 1);
                      bVar16 = SUB81(uVar65 >> 7,0);
                      *(uint *)(local_650.ray + 0x1c0) =
                           (uint)(bVar71 & 1) * *(int *)(local_650.hit + 0x40) |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x1c0);
                      *(uint *)(local_650.ray + 0x1c4) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_650.ray + 0x1c4);
                      *(uint *)(local_650.ray + 0x1c8) =
                           (uint)bVar11 * iVar2 | (uint)!bVar11 * *(int *)(local_650.ray + 0x1c8);
                      *(uint *)(local_650.ray + 0x1cc) =
                           (uint)bVar12 * iVar53 | (uint)!bVar12 * *(int *)(local_650.ray + 0x1cc);
                      *(uint *)(local_650.ray + 0x1d0) =
                           (uint)bVar13 * iVar54 | (uint)!bVar13 * *(int *)(local_650.ray + 0x1d0);
                      *(uint *)(local_650.ray + 0x1d4) =
                           (uint)bVar14 * iVar55 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1d4);
                      *(uint *)(local_650.ray + 0x1d8) =
                           (uint)bVar15 * iVar56 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1d8);
                      *(uint *)(local_650.ray + 0x1dc) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1dc);
                      iVar1 = *(int *)(local_650.hit + 100);
                      iVar2 = *(int *)(local_650.hit + 0x68);
                      iVar53 = *(int *)(local_650.hit + 0x6c);
                      iVar54 = *(int *)(local_650.hit + 0x70);
                      iVar55 = *(int *)(local_650.hit + 0x74);
                      iVar56 = *(int *)(local_650.hit + 0x78);
                      iVar57 = *(int *)(local_650.hit + 0x7c);
                      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar65 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar65 >> 6) & 1);
                      bVar16 = SUB81(uVar65 >> 7,0);
                      *(uint *)(local_650.ray + 0x1e0) =
                           (uint)(bVar71 & 1) * *(int *)(local_650.hit + 0x60) |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x1e0);
                      *(uint *)(local_650.ray + 0x1e4) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_650.ray + 0x1e4);
                      *(uint *)(local_650.ray + 0x1e8) =
                           (uint)bVar11 * iVar2 | (uint)!bVar11 * *(int *)(local_650.ray + 0x1e8);
                      *(uint *)(local_650.ray + 0x1ec) =
                           (uint)bVar12 * iVar53 | (uint)!bVar12 * *(int *)(local_650.ray + 0x1ec);
                      *(uint *)(local_650.ray + 0x1f0) =
                           (uint)bVar13 * iVar54 | (uint)!bVar13 * *(int *)(local_650.ray + 0x1f0);
                      *(uint *)(local_650.ray + 500) =
                           (uint)bVar14 * iVar55 | (uint)!bVar14 * *(int *)(local_650.ray + 500);
                      *(uint *)(local_650.ray + 0x1f8) =
                           (uint)bVar15 * iVar56 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1f8);
                      *(uint *)(local_650.ray + 0x1fc) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1fc);
                      iVar1 = *(int *)(local_650.hit + 0x84);
                      iVar2 = *(int *)(local_650.hit + 0x88);
                      iVar53 = *(int *)(local_650.hit + 0x8c);
                      iVar54 = *(int *)(local_650.hit + 0x90);
                      iVar55 = *(int *)(local_650.hit + 0x94);
                      iVar56 = *(int *)(local_650.hit + 0x98);
                      iVar57 = *(int *)(local_650.hit + 0x9c);
                      bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
                      bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
                      bVar13 = (bool)((byte)(uVar65 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar65 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar65 >> 6) & 1);
                      bVar16 = SUB81(uVar65 >> 7,0);
                      *(uint *)(local_650.ray + 0x200) =
                           (uint)(bVar71 & 1) * *(int *)(local_650.hit + 0x80) |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x200);
                      *(uint *)(local_650.ray + 0x204) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_650.ray + 0x204);
                      *(uint *)(local_650.ray + 0x208) =
                           (uint)bVar11 * iVar2 | (uint)!bVar11 * *(int *)(local_650.ray + 0x208);
                      *(uint *)(local_650.ray + 0x20c) =
                           (uint)bVar12 * iVar53 | (uint)!bVar12 * *(int *)(local_650.ray + 0x20c);
                      *(uint *)(local_650.ray + 0x210) =
                           (uint)bVar13 * iVar54 | (uint)!bVar13 * *(int *)(local_650.ray + 0x210);
                      *(uint *)(local_650.ray + 0x214) =
                           (uint)bVar14 * iVar55 | (uint)!bVar14 * *(int *)(local_650.ray + 0x214);
                      *(uint *)(local_650.ray + 0x218) =
                           (uint)bVar15 * iVar56 | (uint)!bVar15 * *(int *)(local_650.ray + 0x218);
                      *(uint *)(local_650.ray + 0x21c) =
                           (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_650.ray + 0x21c);
                      auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xa0));
                      *(undefined1 (*) [32])(local_650.ray + 0x220) = auVar105;
                      auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xc0));
                      *(undefined1 (*) [32])(local_650.ray + 0x240) = auVar105;
                      auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xe0));
                      *(undefined1 (*) [32])(local_650.ray + 0x260) = auVar105;
                      auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0x100));
                      *(undefined1 (*) [32])(local_650.ray + 0x280) = auVar105;
                      local_520 = *(undefined4 *)(ray + k * 4 + 0x100);
                      uStack_51c = 0;
                      uStack_518 = 0;
                      uStack_514 = 0;
                    }
                    auVar96 = auVar224._0_32_;
                    bVar71 = ~(byte)(1 << ((uint)uVar62 & 0x1f)) & (byte)uVar72;
                    auVar153._4_4_ = local_520;
                    auVar153._0_4_ = local_520;
                    auVar153._8_4_ = local_520;
                    auVar153._12_4_ = local_520;
                    auVar153._16_4_ = local_520;
                    auVar153._20_4_ = local_520;
                    auVar153._24_4_ = local_520;
                    auVar153._28_4_ = local_520;
                    uVar158 = vcmpps_avx512vl(auVar216._0_32_,auVar153,2);
                    if ((bVar71 & (byte)uVar158) == 0) goto LAB_0179c99d;
                    bVar71 = bVar71 & (byte)uVar158;
                    uVar72 = (ulong)bVar71;
                    auVar154._8_4_ = 0x7f800000;
                    auVar154._0_8_ = 0x7f8000007f800000;
                    auVar154._12_4_ = 0x7f800000;
                    auVar154._16_4_ = 0x7f800000;
                    auVar154._20_4_ = 0x7f800000;
                    auVar154._24_4_ = 0x7f800000;
                    auVar154._28_4_ = 0x7f800000;
                    auVar105 = vblendmps_avx512vl(auVar154,auVar216._0_32_);
                    auVar131._0_4_ =
                         (uint)(bVar71 & 1) * auVar105._0_4_ |
                         (uint)!(bool)(bVar71 & 1) * 0x7f800000;
                    bVar10 = (bool)(bVar71 >> 1 & 1);
                    auVar131._4_4_ = (uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar71 >> 2 & 1);
                    auVar131._8_4_ = (uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar71 >> 3 & 1);
                    auVar131._12_4_ = (uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar71 >> 4 & 1);
                    auVar131._16_4_ = (uint)bVar10 * auVar105._16_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar71 >> 5 & 1);
                    auVar131._20_4_ = (uint)bVar10 * auVar105._20_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar71 >> 6 & 1);
                    auVar131._24_4_ = (uint)bVar10 * auVar105._24_4_ | (uint)!bVar10 * 0x7f800000;
                    auVar131._28_4_ =
                         (uint)(bVar71 >> 7) * auVar105._28_4_ |
                         (uint)!(bool)(bVar71 >> 7) * 0x7f800000;
                    auVar105 = vshufps_avx(auVar131,auVar131,0xb1);
                    auVar105 = vminps_avx(auVar131,auVar105);
                    auVar106 = vshufpd_avx(auVar105,auVar105,5);
                    auVar105 = vminps_avx(auVar105,auVar106);
                    auVar106 = vpermpd_avx2(auVar105,0x4e);
                    auVar105 = vminps_avx(auVar105,auVar106);
                    uVar158 = vcmpps_avx512vl(auVar131,auVar105,0);
                    bVar60 = (byte)uVar158 & bVar71;
                    if (bVar60 != 0) {
                      bVar71 = bVar60;
                    }
                    uVar63 = 0;
                    for (uVar64 = (uint)bVar71; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000
                        ) {
                      uVar63 = uVar63 + 1;
                    }
                    uVar62 = (ulong)uVar63;
                  } while( true );
                }
                fVar163 = local_340[uVar62];
                uVar141 = *(undefined4 *)(local_320 + uVar62 * 4);
                fVar210 = 1.0 - fVar163;
                auVar19._8_4_ = 0x80000000;
                auVar19._0_8_ = 0x8000000080000000;
                auVar19._12_4_ = 0x80000000;
                auVar76 = vxorps_avx512vl(ZEXT416((uint)fVar210),auVar19);
                auVar89 = ZEXT416((uint)(fVar163 * fVar210 * 4.0));
                auVar85 = vfnmsub213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar89);
                auVar89 = vfmadd213ss_fma(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),auVar89);
                fVar210 = fVar210 * auVar76._0_4_ * 0.5;
                fVar211 = auVar85._0_4_ * 0.5;
                auVar205 = ZEXT464((uint)fVar211);
                fVar212 = auVar89._0_4_ * 0.5;
                fVar173 = fVar163 * fVar163 * 0.5;
                auVar185._0_4_ = fVar173 * fVar155;
                auVar185._4_4_ = fVar173 * fVar156;
                auVar185._8_4_ = fVar173 * fVar157;
                auVar185._12_4_ = fVar173 * fVar59;
                auVar167._4_4_ = fVar212;
                auVar167._0_4_ = fVar212;
                auVar167._8_4_ = fVar212;
                auVar167._12_4_ = fVar212;
                auVar89 = vfmadd132ps_fma(auVar167,auVar185,auVar75);
                auVar186._4_4_ = fVar211;
                auVar186._0_4_ = fVar211;
                auVar186._8_4_ = fVar211;
                auVar186._12_4_ = fVar211;
                auVar89 = vfmadd132ps_fma(auVar186,auVar89,auVar79);
                auVar196 = ZEXT1664(auVar89);
                auVar168._4_4_ = fVar210;
                auVar168._0_4_ = fVar210;
                auVar168._8_4_ = fVar210;
                auVar168._12_4_ = fVar210;
                auVar89 = vfmadd213ps_fma(auVar168,auVar78,auVar89);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar62 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar89._0_4_;
                uVar8 = vextractps_avx(auVar89,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                uVar8 = vextractps_avx(auVar89,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar8;
                *(float *)(ray + k * 4 + 0x1e0) = fVar163;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar141;
                *(undefined4 *)(ray + k * 4 + 0x220) = uVar3;
                *(uint *)(ray + k * 4 + 0x240) = uVar6;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_0179c99d:
                uVar63 = local_620._0_4_;
              }
            }
          }
        }
      }
    }
    local_620._0_4_ = uVar63;
    if (8 < iVar7) {
      local_5e0 = vpbroadcastd_avx512vl();
      local_520 = local_610._0_4_;
      uStack_51c = local_610._0_4_;
      uStack_518 = local_610._0_4_;
      uStack_514 = local_610._0_4_;
      uStack_510 = local_610._0_4_;
      uStack_50c = local_610._0_4_;
      uStack_508 = local_610._0_4_;
      uStack_504 = local_610._0_4_;
      local_540._4_4_ = local_620._0_4_;
      local_540._0_4_ = local_620._0_4_;
      local_540._8_4_ = local_620._0_4_;
      local_540._12_4_ = local_620._0_4_;
      local_540._16_4_ = local_620._0_4_;
      local_540._20_4_ = local_620._0_4_;
      local_540._24_4_ = local_620._0_4_;
      local_540._28_4_ = local_620._0_4_;
      local_100 = 1.0 / (float)local_560._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar70 = 8;
      local_580 = auVar96;
LAB_0179ca44:
      if (lVar70 < lVar66) {
        auVar105 = vpbroadcastd_avx512vl();
        auVar105 = vpor_avx2(auVar105,_DAT_01fb4ba0);
        uVar18 = vpcmpd_avx512vl(auVar105,local_5e0,1);
        auVar105 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 * 4 + lVar69);
        auVar106 = *(undefined1 (*) [32])(lVar69 + 0x21fffac + lVar70 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar69 + 0x2200430 + lVar70 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar69 + 0x22008b4 + lVar70 * 4);
        auVar224._0_4_ = auVar102._0_4_ * (float)local_4e0._0_4_;
        auVar224._4_4_ = auVar102._4_4_ * (float)local_4e0._4_4_;
        auVar224._8_4_ = auVar102._8_4_ * fStack_4d8;
        auVar224._12_4_ = auVar102._12_4_ * fStack_4d4;
        auVar224._16_4_ = auVar102._16_4_ * fStack_4d0;
        auVar224._20_4_ = auVar102._20_4_ * fStack_4cc;
        auVar224._28_36_ = auVar205._28_36_;
        auVar224._24_4_ = auVar102._24_4_ * fStack_4c8;
        auVar205._0_4_ = auVar102._0_4_ * (float)local_500._0_4_;
        auVar205._4_4_ = auVar102._4_4_ * (float)local_500._4_4_;
        auVar205._8_4_ = auVar102._8_4_ * fStack_4f8;
        auVar205._12_4_ = auVar102._12_4_ * fStack_4f4;
        auVar205._16_4_ = auVar102._16_4_ * fStack_4f0;
        auVar205._20_4_ = auVar102._20_4_ * fStack_4ec;
        auVar205._28_36_ = auVar196._28_36_;
        auVar205._24_4_ = auVar102._24_4_ * fStack_4e8;
        auVar90 = vmulps_avx512vl(local_e0,auVar102);
        auVar91 = vfmadd231ps_avx512vl(auVar224._0_32_,auVar103,local_4a0);
        auVar101 = vfmadd231ps_avx512vl(auVar205._0_32_,auVar103,local_4c0);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar103,local_c0);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar106,local_460);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar106,local_480);
        auVar100 = vfmadd231ps_avx512vl(auVar90,auVar106,local_a0);
        auVar89 = vfmadd231ps_fma(auVar91,auVar105,local_420);
        auVar205 = ZEXT1664(auVar89);
        auVar85 = vfmadd231ps_fma(auVar101,auVar105,local_440);
        auVar196 = ZEXT1664(auVar85);
        auVar90 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 * 4 + lVar69);
        auVar91 = *(undefined1 (*) [32])(lVar69 + 0x22023cc + lVar70 * 4);
        auVar94 = vfmadd231ps_avx512vl(auVar100,auVar105,local_80);
        auVar101 = *(undefined1 (*) [32])(lVar69 + 0x2202850 + lVar70 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar69 + 0x2202cd4 + lVar70 * 4);
        auVar216._0_4_ = auVar100._0_4_ * (float)local_4e0._0_4_;
        auVar216._4_4_ = auVar100._4_4_ * (float)local_4e0._4_4_;
        auVar216._8_4_ = auVar100._8_4_ * fStack_4d8;
        auVar216._12_4_ = auVar100._12_4_ * fStack_4d4;
        auVar216._16_4_ = auVar100._16_4_ * fStack_4d0;
        auVar216._20_4_ = auVar100._20_4_ * fStack_4cc;
        auVar216._28_36_ = auVar208._28_36_;
        auVar216._24_4_ = auVar100._24_4_ * fStack_4c8;
        auVar36._4_4_ = auVar100._4_4_ * (float)local_500._4_4_;
        auVar36._0_4_ = auVar100._0_4_ * (float)local_500._0_4_;
        auVar36._8_4_ = auVar100._8_4_ * fStack_4f8;
        auVar36._12_4_ = auVar100._12_4_ * fStack_4f4;
        auVar36._16_4_ = auVar100._16_4_ * fStack_4f0;
        auVar36._20_4_ = auVar100._20_4_ * fStack_4ec;
        auVar36._24_4_ = auVar100._24_4_ * fStack_4e8;
        auVar36._28_4_ = uStack_4e4;
        auVar92 = vmulps_avx512vl(local_e0,auVar100);
        auVar93 = vfmadd231ps_avx512vl(auVar216._0_32_,auVar101,local_4a0);
        auVar95 = vfmadd231ps_avx512vl(auVar36,auVar101,local_4c0);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar101,local_c0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,local_460);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_480);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar91,local_a0);
        auVar76 = vfmadd231ps_fma(auVar93,auVar90,local_420);
        auVar208 = ZEXT1664(auVar76);
        auVar84 = vfmadd231ps_fma(auVar95,auVar90,local_440);
        auVar95 = vfmadd231ps_avx512vl(auVar92,auVar90,local_80);
        auVar96 = vmaxps_avx512vl(auVar94,auVar95);
        auVar92 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar89));
        auVar93 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar85));
        auVar97 = vmulps_avx512vl(ZEXT1632(auVar85),auVar92);
        auVar98 = vmulps_avx512vl(ZEXT1632(auVar89),auVar93);
        auVar97 = vsubps_avx512vl(auVar97,auVar98);
        auVar98 = vmulps_avx512vl(auVar93,auVar93);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar92,auVar92);
        auVar96 = vmulps_avx512vl(auVar96,auVar96);
        auVar96 = vmulps_avx512vl(auVar96,auVar98);
        auVar97 = vmulps_avx512vl(auVar97,auVar97);
        uVar158 = vcmpps_avx512vl(auVar97,auVar96,2);
        bVar71 = (byte)uVar18 & (byte)uVar158;
        if (bVar71 != 0) {
          auVar100 = vmulps_avx512vl(local_280,auVar100);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_260,auVar100);
          auVar91 = vfmadd213ps_avx512vl(auVar91,local_240,auVar101);
          auVar90 = vfmadd213ps_avx512vl(auVar90,local_580,auVar91);
          auVar102 = vmulps_avx512vl(local_280,auVar102);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_260,auVar102);
          auVar106 = vfmadd213ps_avx512vl(auVar106,local_240,auVar103);
          auVar91 = vfmadd213ps_avx512vl(auVar105,local_580,auVar106);
          auVar105 = *(undefined1 (*) [32])(lVar69 + 0x2200d38 + lVar70 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar69 + 0x22011bc + lVar70 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar69 + 0x2201640 + lVar70 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar69 + 0x2201ac4 + lVar70 * 4);
          auVar101 = vmulps_avx512vl(_local_4e0,auVar102);
          auVar100 = vmulps_avx512vl(_local_500,auVar102);
          auVar102 = vmulps_avx512vl(local_280,auVar102);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,local_4a0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,local_4c0);
          auVar103 = vfmadd231ps_avx512vl(auVar102,local_260,auVar103);
          auVar102 = vfmadd231ps_avx512vl(auVar101,auVar106,local_460);
          auVar101 = vfmadd231ps_avx512vl(auVar100,auVar106,local_480);
          auVar106 = vfmadd231ps_avx512vl(auVar103,local_240,auVar106);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar105,local_420);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,local_440);
          auVar83 = vfmadd231ps_fma(auVar106,auVar105,local_580);
          auVar105 = *(undefined1 (*) [32])(lVar69 + 0x2203158 + lVar70 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar69 + 0x2203a60 + lVar70 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar69 + 0x2203ee4 + lVar70 * 4);
          auVar100 = vmulps_avx512vl(_local_4e0,auVar103);
          auVar96 = vmulps_avx512vl(_local_500,auVar103);
          auVar103 = vmulps_avx512vl(local_280,auVar103);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,local_4a0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar106,local_4c0);
          auVar103 = vfmadd231ps_avx512vl(auVar103,local_260,auVar106);
          auVar106 = *(undefined1 (*) [32])(lVar69 + 0x22035dc + lVar70 * 4);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,local_460);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar106,local_480);
          auVar106 = vfmadd231ps_avx512vl(auVar103,local_240,auVar106);
          auVar103 = vfmadd231ps_avx512vl(auVar100,auVar105,local_420);
          auVar100 = vfmadd231ps_avx512vl(auVar96,auVar105,local_440);
          auVar106 = vfmadd231ps_avx512vl(auVar106,local_580,auVar105);
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar102,auVar96);
          vandps_avx512vl(auVar101,auVar96);
          auVar105 = vmaxps_avx(auVar96,auVar96);
          vandps_avx512vl(ZEXT1632(auVar83),auVar96);
          auVar105 = vmaxps_avx(auVar105,auVar96);
          auVar58._4_4_ = uStack_51c;
          auVar58._0_4_ = local_520;
          auVar58._8_4_ = uStack_518;
          auVar58._12_4_ = uStack_514;
          auVar58._16_4_ = uStack_510;
          auVar58._20_4_ = uStack_50c;
          auVar58._24_4_ = uStack_508;
          auVar58._28_4_ = uStack_504;
          uVar62 = vcmpps_avx512vl(auVar105,auVar58,1);
          bVar10 = (bool)((byte)uVar62 & 1);
          auVar119._0_4_ = (float)((uint)bVar10 * auVar92._0_4_ | (uint)!bVar10 * auVar102._0_4_);
          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar10 * auVar92._4_4_ | (uint)!bVar10 * auVar102._4_4_);
          bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar10 * auVar92._8_4_ | (uint)!bVar10 * auVar102._8_4_);
          bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar10 * auVar92._12_4_ | (uint)!bVar10 * auVar102._12_4_)
          ;
          bVar10 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar119._16_4_ = (float)((uint)bVar10 * auVar92._16_4_ | (uint)!bVar10 * auVar102._16_4_)
          ;
          bVar10 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar119._20_4_ = (float)((uint)bVar10 * auVar92._20_4_ | (uint)!bVar10 * auVar102._20_4_)
          ;
          bVar10 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar119._24_4_ = (float)((uint)bVar10 * auVar92._24_4_ | (uint)!bVar10 * auVar102._24_4_)
          ;
          bVar10 = SUB81(uVar62 >> 7,0);
          auVar119._28_4_ = (uint)bVar10 * auVar92._28_4_ | (uint)!bVar10 * auVar102._28_4_;
          bVar10 = (bool)((byte)uVar62 & 1);
          auVar120._0_4_ = (float)((uint)bVar10 * auVar93._0_4_ | (uint)!bVar10 * auVar101._0_4_);
          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar10 * auVar93._4_4_ | (uint)!bVar10 * auVar101._4_4_);
          bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar10 * auVar93._8_4_ | (uint)!bVar10 * auVar101._8_4_);
          bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar10 * auVar93._12_4_ | (uint)!bVar10 * auVar101._12_4_)
          ;
          bVar10 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar10 * auVar93._16_4_ | (uint)!bVar10 * auVar101._16_4_)
          ;
          bVar10 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar10 * auVar93._20_4_ | (uint)!bVar10 * auVar101._20_4_)
          ;
          bVar10 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar10 * auVar93._24_4_ | (uint)!bVar10 * auVar101._24_4_)
          ;
          bVar10 = SUB81(uVar62 >> 7,0);
          auVar120._28_4_ = (uint)bVar10 * auVar93._28_4_ | (uint)!bVar10 * auVar101._28_4_;
          vandps_avx512vl(auVar103,auVar96);
          vandps_avx512vl(auVar100,auVar96);
          auVar105 = vmaxps_avx(auVar120,auVar120);
          vandps_avx512vl(auVar106,auVar96);
          auVar105 = vmaxps_avx(auVar105,auVar120);
          uVar62 = vcmpps_avx512vl(auVar105,auVar58,1);
          bVar10 = (bool)((byte)uVar62 & 1);
          auVar121._0_4_ = (uint)bVar10 * auVar92._0_4_ | (uint)!bVar10 * auVar103._0_4_;
          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar10 * auVar92._4_4_ | (uint)!bVar10 * auVar103._4_4_;
          bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar10 * auVar92._8_4_ | (uint)!bVar10 * auVar103._8_4_;
          bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar10 * auVar92._12_4_ | (uint)!bVar10 * auVar103._12_4_;
          bVar10 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar121._16_4_ = (uint)bVar10 * auVar92._16_4_ | (uint)!bVar10 * auVar103._16_4_;
          bVar10 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar121._20_4_ = (uint)bVar10 * auVar92._20_4_ | (uint)!bVar10 * auVar103._20_4_;
          bVar10 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar121._24_4_ = (uint)bVar10 * auVar92._24_4_ | (uint)!bVar10 * auVar103._24_4_;
          bVar10 = SUB81(uVar62 >> 7,0);
          auVar121._28_4_ = (uint)bVar10 * auVar92._28_4_ | (uint)!bVar10 * auVar103._28_4_;
          bVar10 = (bool)((byte)uVar62 & 1);
          auVar122._0_4_ = (float)((uint)bVar10 * auVar93._0_4_ | (uint)!bVar10 * auVar100._0_4_);
          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar10 * auVar93._4_4_ | (uint)!bVar10 * auVar100._4_4_);
          bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar10 * auVar93._8_4_ | (uint)!bVar10 * auVar100._8_4_);
          bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar10 * auVar93._12_4_ | (uint)!bVar10 * auVar100._12_4_)
          ;
          bVar10 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar122._16_4_ = (float)((uint)bVar10 * auVar93._16_4_ | (uint)!bVar10 * auVar100._16_4_)
          ;
          bVar10 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar122._20_4_ = (float)((uint)bVar10 * auVar93._20_4_ | (uint)!bVar10 * auVar100._20_4_)
          ;
          bVar10 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar122._24_4_ = (float)((uint)bVar10 * auVar93._24_4_ | (uint)!bVar10 * auVar100._24_4_)
          ;
          bVar10 = SUB81(uVar62 >> 7,0);
          auVar122._28_4_ = (uint)bVar10 * auVar93._28_4_ | (uint)!bVar10 * auVar100._28_4_;
          auVar215._8_4_ = 0x80000000;
          auVar215._0_8_ = 0x8000000080000000;
          auVar215._12_4_ = 0x80000000;
          auVar215._16_4_ = 0x80000000;
          auVar215._20_4_ = 0x80000000;
          auVar215._24_4_ = 0x80000000;
          auVar215._28_4_ = 0x80000000;
          auVar105 = vxorps_avx512vl(auVar121,auVar215);
          auVar88 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
          auVar106 = vfmadd213ps_avx512vl(auVar119,auVar119,ZEXT1632(auVar88));
          auVar83 = vfmadd231ps_fma(auVar106,auVar120,auVar120);
          auVar106 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
          auVar223._8_4_ = 0xbf000000;
          auVar223._0_8_ = 0xbf000000bf000000;
          auVar223._12_4_ = 0xbf000000;
          auVar223._16_4_ = 0xbf000000;
          auVar223._20_4_ = 0xbf000000;
          auVar223._24_4_ = 0xbf000000;
          auVar223._28_4_ = 0xbf000000;
          fVar163 = auVar106._0_4_;
          fVar210 = auVar106._4_4_;
          fVar211 = auVar106._8_4_;
          fVar212 = auVar106._12_4_;
          fVar173 = auVar106._16_4_;
          fVar182 = auVar106._20_4_;
          fVar73 = auVar106._24_4_;
          auVar37._4_4_ = fVar210 * fVar210 * fVar210 * auVar83._4_4_ * -0.5;
          auVar37._0_4_ = fVar163 * fVar163 * fVar163 * auVar83._0_4_ * -0.5;
          auVar37._8_4_ = fVar211 * fVar211 * fVar211 * auVar83._8_4_ * -0.5;
          auVar37._12_4_ = fVar212 * fVar212 * fVar212 * auVar83._12_4_ * -0.5;
          auVar37._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar37._20_4_ = fVar182 * fVar182 * fVar182 * -0.0;
          auVar37._24_4_ = fVar73 * fVar73 * fVar73 * -0.0;
          auVar37._28_4_ = auVar120._28_4_;
          auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar106 = vfmadd231ps_avx512vl(auVar37,auVar103,auVar106);
          auVar38._4_4_ = auVar120._4_4_ * auVar106._4_4_;
          auVar38._0_4_ = auVar120._0_4_ * auVar106._0_4_;
          auVar38._8_4_ = auVar120._8_4_ * auVar106._8_4_;
          auVar38._12_4_ = auVar120._12_4_ * auVar106._12_4_;
          auVar38._16_4_ = auVar120._16_4_ * auVar106._16_4_;
          auVar38._20_4_ = auVar120._20_4_ * auVar106._20_4_;
          auVar38._24_4_ = auVar120._24_4_ * auVar106._24_4_;
          auVar38._28_4_ = 0;
          auVar39._4_4_ = auVar106._4_4_ * -auVar119._4_4_;
          auVar39._0_4_ = auVar106._0_4_ * -auVar119._0_4_;
          auVar39._8_4_ = auVar106._8_4_ * -auVar119._8_4_;
          auVar39._12_4_ = auVar106._12_4_ * -auVar119._12_4_;
          auVar39._16_4_ = auVar106._16_4_ * -auVar119._16_4_;
          auVar39._20_4_ = auVar106._20_4_ * -auVar119._20_4_;
          auVar39._24_4_ = auVar106._24_4_ * -auVar119._24_4_;
          auVar39._28_4_ = auVar120._28_4_;
          auVar102 = vmulps_avx512vl(auVar106,ZEXT1632(auVar88));
          auVar100 = ZEXT1632(auVar88);
          auVar106 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar100);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar122,auVar122);
          auVar101 = vrsqrt14ps_avx512vl(auVar106);
          auVar106 = vmulps_avx512vl(auVar106,auVar223);
          fVar163 = auVar101._0_4_;
          fVar210 = auVar101._4_4_;
          fVar211 = auVar101._8_4_;
          fVar212 = auVar101._12_4_;
          fVar173 = auVar101._16_4_;
          fVar182 = auVar101._20_4_;
          fVar73 = auVar101._24_4_;
          auVar40._4_4_ = fVar210 * fVar210 * fVar210 * auVar106._4_4_;
          auVar40._0_4_ = fVar163 * fVar163 * fVar163 * auVar106._0_4_;
          auVar40._8_4_ = fVar211 * fVar211 * fVar211 * auVar106._8_4_;
          auVar40._12_4_ = fVar212 * fVar212 * fVar212 * auVar106._12_4_;
          auVar40._16_4_ = fVar173 * fVar173 * fVar173 * auVar106._16_4_;
          auVar40._20_4_ = fVar182 * fVar182 * fVar182 * auVar106._20_4_;
          auVar40._24_4_ = fVar73 * fVar73 * fVar73 * auVar106._24_4_;
          auVar40._28_4_ = auVar106._28_4_;
          auVar106 = vfmadd231ps_avx512vl(auVar40,auVar103,auVar101);
          auVar41._4_4_ = auVar122._4_4_ * auVar106._4_4_;
          auVar41._0_4_ = auVar122._0_4_ * auVar106._0_4_;
          auVar41._8_4_ = auVar122._8_4_ * auVar106._8_4_;
          auVar41._12_4_ = auVar122._12_4_ * auVar106._12_4_;
          auVar41._16_4_ = auVar122._16_4_ * auVar106._16_4_;
          auVar41._20_4_ = auVar122._20_4_ * auVar106._20_4_;
          auVar41._24_4_ = auVar122._24_4_ * auVar106._24_4_;
          auVar41._28_4_ = auVar101._28_4_;
          auVar42._4_4_ = auVar106._4_4_ * auVar105._4_4_;
          auVar42._0_4_ = auVar106._0_4_ * auVar105._0_4_;
          auVar42._8_4_ = auVar106._8_4_ * auVar105._8_4_;
          auVar42._12_4_ = auVar106._12_4_ * auVar105._12_4_;
          auVar42._16_4_ = auVar106._16_4_ * auVar105._16_4_;
          auVar42._20_4_ = auVar106._20_4_ * auVar105._20_4_;
          auVar42._24_4_ = auVar106._24_4_ * auVar105._24_4_;
          auVar42._28_4_ = auVar105._28_4_;
          auVar105 = vmulps_avx512vl(auVar106,auVar100);
          auVar83 = vfmadd213ps_fma(auVar38,auVar94,ZEXT1632(auVar89));
          auVar77 = vfmadd213ps_fma(auVar39,auVar94,ZEXT1632(auVar85));
          auVar103 = vfmadd213ps_avx512vl(auVar102,auVar94,auVar91);
          auVar101 = vfmadd213ps_avx512vl(auVar41,auVar95,ZEXT1632(auVar76));
          auVar80 = vfnmadd213ps_fma(auVar38,auVar94,ZEXT1632(auVar89));
          auVar89 = vfmadd213ps_fma(auVar42,auVar95,ZEXT1632(auVar84));
          auVar82 = vfnmadd213ps_fma(auVar39,auVar94,ZEXT1632(auVar85));
          auVar85 = vfmadd213ps_fma(auVar105,auVar95,auVar90);
          auVar142 = vfnmadd231ps_fma(auVar91,auVar94,auVar102);
          auVar81 = vfnmadd213ps_fma(auVar41,auVar95,ZEXT1632(auVar76));
          auVar86 = vfnmadd213ps_fma(auVar42,auVar95,ZEXT1632(auVar84));
          auVar87 = vfnmadd231ps_fma(auVar90,auVar95,auVar105);
          auVar90 = vsubps_avx512vl(auVar101,ZEXT1632(auVar80));
          auVar105 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar82));
          auVar106 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar142));
          auVar43._4_4_ = auVar105._4_4_ * auVar142._4_4_;
          auVar43._0_4_ = auVar105._0_4_ * auVar142._0_4_;
          auVar43._8_4_ = auVar105._8_4_ * auVar142._8_4_;
          auVar43._12_4_ = auVar105._12_4_ * auVar142._12_4_;
          auVar43._16_4_ = auVar105._16_4_ * 0.0;
          auVar43._20_4_ = auVar105._20_4_ * 0.0;
          auVar43._24_4_ = auVar105._24_4_ * 0.0;
          auVar43._28_4_ = auVar102._28_4_;
          auVar76 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar82),auVar106);
          auVar44._4_4_ = auVar106._4_4_ * auVar80._4_4_;
          auVar44._0_4_ = auVar106._0_4_ * auVar80._0_4_;
          auVar44._8_4_ = auVar106._8_4_ * auVar80._8_4_;
          auVar44._12_4_ = auVar106._12_4_ * auVar80._12_4_;
          auVar44._16_4_ = auVar106._16_4_ * 0.0;
          auVar44._20_4_ = auVar106._20_4_ * 0.0;
          auVar44._24_4_ = auVar106._24_4_ * 0.0;
          auVar44._28_4_ = auVar106._28_4_;
          auVar84 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar142),auVar90);
          auVar45._4_4_ = auVar82._4_4_ * auVar90._4_4_;
          auVar45._0_4_ = auVar82._0_4_ * auVar90._0_4_;
          auVar45._8_4_ = auVar82._8_4_ * auVar90._8_4_;
          auVar45._12_4_ = auVar82._12_4_ * auVar90._12_4_;
          auVar45._16_4_ = auVar90._16_4_ * 0.0;
          auVar45._20_4_ = auVar90._20_4_ * 0.0;
          auVar45._24_4_ = auVar90._24_4_ * 0.0;
          auVar45._28_4_ = auVar90._28_4_;
          auVar17 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar80),auVar105);
          auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar17),auVar100,ZEXT1632(auVar84));
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,ZEXT1632(auVar76));
          auVar97 = ZEXT1632(auVar88);
          uVar62 = vcmpps_avx512vl(auVar105,auVar97,2);
          bVar60 = (byte)uVar62;
          fVar133 = (float)((uint)(bVar60 & 1) * auVar83._0_4_ |
                           (uint)!(bool)(bVar60 & 1) * auVar81._0_4_);
          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
          fVar135 = (float)((uint)bVar10 * auVar83._4_4_ | (uint)!bVar10 * auVar81._4_4_);
          bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
          fVar138 = (float)((uint)bVar10 * auVar83._8_4_ | (uint)!bVar10 * auVar81._8_4_);
          bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
          fVar139 = (float)((uint)bVar10 * auVar83._12_4_ | (uint)!bVar10 * auVar81._12_4_);
          auVar100 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar138,CONCAT44(fVar135,fVar133))));
          fVar134 = (float)((uint)(bVar60 & 1) * auVar77._0_4_ |
                           (uint)!(bool)(bVar60 & 1) * auVar86._0_4_);
          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
          fVar137 = (float)((uint)bVar10 * auVar77._4_4_ | (uint)!bVar10 * auVar86._4_4_);
          bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
          fVar136 = (float)((uint)bVar10 * auVar77._8_4_ | (uint)!bVar10 * auVar86._8_4_);
          bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
          fVar140 = (float)((uint)bVar10 * auVar77._12_4_ | (uint)!bVar10 * auVar86._12_4_);
          auVar92 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar136,CONCAT44(fVar137,fVar134))));
          auVar123._0_4_ =
               (float)((uint)(bVar60 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar60 & 1) * auVar87._0_4_);
          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar10 * auVar103._4_4_ | (uint)!bVar10 * auVar87._4_4_);
          bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar10 * auVar103._8_4_ | (uint)!bVar10 * auVar87._8_4_);
          bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar10 * auVar103._12_4_ | (uint)!bVar10 * auVar87._12_4_)
          ;
          fVar211 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar103._16_4_);
          auVar123._16_4_ = fVar211;
          fVar210 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar103._20_4_);
          auVar123._20_4_ = fVar210;
          fVar163 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar103._24_4_);
          auVar123._24_4_ = fVar163;
          iVar1 = (uint)(byte)(uVar62 >> 7) * auVar103._28_4_;
          auVar123._28_4_ = iVar1;
          auVar105 = vblendmps_avx512vl(ZEXT1632(auVar80),auVar101);
          auVar124._0_4_ =
               (uint)(bVar60 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar76._0_4_;
          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * auVar76._4_4_;
          bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * auVar76._8_4_;
          bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * auVar76._12_4_;
          auVar124._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar105._16_4_;
          auVar124._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar105._20_4_;
          auVar124._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar105._24_4_;
          auVar124._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar105._28_4_;
          auVar105 = vblendmps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar89));
          auVar125._0_4_ =
               (float)((uint)(bVar60 & 1) * auVar105._0_4_ |
                      (uint)!(bool)(bVar60 & 1) * auVar83._0_4_);
          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * auVar83._4_4_);
          bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * auVar83._8_4_);
          bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * auVar83._12_4_)
          ;
          fVar212 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar105._16_4_);
          auVar125._16_4_ = fVar212;
          fVar173 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar105._20_4_);
          auVar125._20_4_ = fVar173;
          fVar182 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar105._24_4_);
          auVar125._24_4_ = fVar182;
          auVar125._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar105._28_4_;
          auVar105 = vblendmps_avx512vl(ZEXT1632(auVar142),ZEXT1632(auVar85));
          auVar126._0_4_ =
               (float)((uint)(bVar60 & 1) * auVar105._0_4_ |
                      (uint)!(bool)(bVar60 & 1) * auVar77._0_4_);
          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * auVar77._4_4_);
          bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * auVar77._8_4_);
          bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * auVar77._12_4_)
          ;
          fVar73 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar105._16_4_);
          auVar126._16_4_ = fVar73;
          fVar74 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar105._20_4_);
          auVar126._20_4_ = fVar74;
          fVar132 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar105._24_4_);
          auVar126._24_4_ = fVar132;
          iVar2 = (uint)(byte)(uVar62 >> 7) * auVar105._28_4_;
          auVar126._28_4_ = iVar2;
          auVar127._0_4_ =
               (uint)(bVar60 & 1) * (int)auVar80._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar101._0_4_;
          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar10 * (int)auVar80._4_4_ | (uint)!bVar10 * auVar101._4_4_;
          bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar10 * (int)auVar80._8_4_ | (uint)!bVar10 * auVar101._8_4_;
          bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar10 * (int)auVar80._12_4_ | (uint)!bVar10 * auVar101._12_4_;
          auVar127._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar101._16_4_;
          auVar127._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar101._20_4_;
          auVar127._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar101._24_4_;
          auVar127._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar101._28_4_;
          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar62 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar62 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar101 = vsubps_avx512vl(auVar127,auVar100);
          auVar106 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar82._12_4_ |
                                                   (uint)!bVar14 * auVar89._12_4_,
                                                   CONCAT48((uint)bVar12 * (int)auVar82._8_4_ |
                                                            (uint)!bVar12 * auVar89._8_4_,
                                                            CONCAT44((uint)bVar10 *
                                                                     (int)auVar82._4_4_ |
                                                                     (uint)!bVar10 * auVar89._4_4_,
                                                                     (uint)(bVar60 & 1) *
                                                                     (int)auVar82._0_4_ |
                                                                     (uint)!(bool)(bVar60 & 1) *
                                                                     auVar89._0_4_)))),auVar92);
          auVar205 = ZEXT3264(auVar106);
          auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar142._12_4_ |
                                                   (uint)!bVar15 * auVar85._12_4_,
                                                   CONCAT48((uint)bVar13 * (int)auVar142._8_4_ |
                                                            (uint)!bVar13 * auVar85._8_4_,
                                                            CONCAT44((uint)bVar11 *
                                                                     (int)auVar142._4_4_ |
                                                                     (uint)!bVar11 * auVar85._4_4_,
                                                                     (uint)(bVar60 & 1) *
                                                                     (int)auVar142._0_4_ |
                                                                     (uint)!(bool)(bVar60 & 1) *
                                                                     auVar85._0_4_)))),auVar123);
          auVar102 = vsubps_avx(auVar100,auVar124);
          auVar208 = ZEXT3264(auVar102);
          auVar90 = vsubps_avx(auVar92,auVar125);
          auVar91 = vsubps_avx(auVar123,auVar126);
          auVar46._4_4_ = auVar103._4_4_ * fVar135;
          auVar46._0_4_ = auVar103._0_4_ * fVar133;
          auVar46._8_4_ = auVar103._8_4_ * fVar138;
          auVar46._12_4_ = auVar103._12_4_ * fVar139;
          auVar46._16_4_ = auVar103._16_4_ * 0.0;
          auVar46._20_4_ = auVar103._20_4_ * 0.0;
          auVar46._24_4_ = auVar103._24_4_ * 0.0;
          auVar46._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar46,auVar123,auVar101);
          auVar180._0_4_ = fVar134 * auVar101._0_4_;
          auVar180._4_4_ = fVar137 * auVar101._4_4_;
          auVar180._8_4_ = fVar136 * auVar101._8_4_;
          auVar180._12_4_ = fVar140 * auVar101._12_4_;
          auVar180._16_4_ = auVar101._16_4_ * 0.0;
          auVar180._20_4_ = auVar101._20_4_ * 0.0;
          auVar180._24_4_ = auVar101._24_4_ * 0.0;
          auVar180._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar180,auVar100,auVar106);
          auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar97,ZEXT1632(auVar89));
          auVar193._0_4_ = auVar106._0_4_ * auVar123._0_4_;
          auVar193._4_4_ = auVar106._4_4_ * auVar123._4_4_;
          auVar193._8_4_ = auVar106._8_4_ * auVar123._8_4_;
          auVar193._12_4_ = auVar106._12_4_ * auVar123._12_4_;
          auVar193._16_4_ = auVar106._16_4_ * fVar211;
          auVar193._20_4_ = auVar106._20_4_ * fVar210;
          auVar193._24_4_ = auVar106._24_4_ * fVar163;
          auVar193._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar193,auVar92,auVar103);
          auVar93 = vfmadd231ps_avx512vl(auVar105,auVar97,ZEXT1632(auVar89));
          auVar105 = vmulps_avx512vl(auVar91,auVar124);
          auVar105 = vfmsub231ps_avx512vl(auVar105,auVar102,auVar126);
          auVar47._4_4_ = auVar90._4_4_ * auVar126._4_4_;
          auVar47._0_4_ = auVar90._0_4_ * auVar126._0_4_;
          auVar47._8_4_ = auVar90._8_4_ * auVar126._8_4_;
          auVar47._12_4_ = auVar90._12_4_ * auVar126._12_4_;
          auVar47._16_4_ = auVar90._16_4_ * fVar73;
          auVar47._20_4_ = auVar90._20_4_ * fVar74;
          auVar47._24_4_ = auVar90._24_4_ * fVar132;
          auVar47._28_4_ = iVar2;
          auVar89 = vfmsub231ps_fma(auVar47,auVar125,auVar91);
          auVar194._0_4_ = auVar125._0_4_ * auVar102._0_4_;
          auVar194._4_4_ = auVar125._4_4_ * auVar102._4_4_;
          auVar194._8_4_ = auVar125._8_4_ * auVar102._8_4_;
          auVar194._12_4_ = auVar125._12_4_ * auVar102._12_4_;
          auVar194._16_4_ = fVar212 * auVar102._16_4_;
          auVar194._20_4_ = fVar173 * auVar102._20_4_;
          auVar194._24_4_ = fVar182 * auVar102._24_4_;
          auVar194._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar194,auVar90,auVar124);
          auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar97,auVar105);
          auVar96 = vfmadd231ps_avx512vl(auVar105,auVar97,ZEXT1632(auVar89));
          auVar196 = ZEXT3264(auVar96);
          auVar105 = vmaxps_avx(auVar93,auVar96);
          uVar158 = vcmpps_avx512vl(auVar105,auVar97,2);
          bVar71 = bVar71 & (byte)uVar158;
          if (bVar71 != 0) {
            auVar48._4_4_ = auVar91._4_4_ * auVar106._4_4_;
            auVar48._0_4_ = auVar91._0_4_ * auVar106._0_4_;
            auVar48._8_4_ = auVar91._8_4_ * auVar106._8_4_;
            auVar48._12_4_ = auVar91._12_4_ * auVar106._12_4_;
            auVar48._16_4_ = auVar91._16_4_ * auVar106._16_4_;
            auVar48._20_4_ = auVar91._20_4_ * auVar106._20_4_;
            auVar48._24_4_ = auVar91._24_4_ * auVar106._24_4_;
            auVar48._28_4_ = auVar105._28_4_;
            auVar84 = vfmsub231ps_fma(auVar48,auVar90,auVar103);
            auVar49._4_4_ = auVar103._4_4_ * auVar102._4_4_;
            auVar49._0_4_ = auVar103._0_4_ * auVar102._0_4_;
            auVar49._8_4_ = auVar103._8_4_ * auVar102._8_4_;
            auVar49._12_4_ = auVar103._12_4_ * auVar102._12_4_;
            auVar49._16_4_ = auVar103._16_4_ * auVar102._16_4_;
            auVar49._20_4_ = auVar103._20_4_ * auVar102._20_4_;
            auVar49._24_4_ = auVar103._24_4_ * auVar102._24_4_;
            auVar49._28_4_ = auVar103._28_4_;
            auVar76 = vfmsub231ps_fma(auVar49,auVar101,auVar91);
            auVar50._4_4_ = auVar90._4_4_ * auVar101._4_4_;
            auVar50._0_4_ = auVar90._0_4_ * auVar101._0_4_;
            auVar50._8_4_ = auVar90._8_4_ * auVar101._8_4_;
            auVar50._12_4_ = auVar90._12_4_ * auVar101._12_4_;
            auVar50._16_4_ = auVar90._16_4_ * auVar101._16_4_;
            auVar50._20_4_ = auVar90._20_4_ * auVar101._20_4_;
            auVar50._24_4_ = auVar90._24_4_ * auVar101._24_4_;
            auVar50._28_4_ = auVar90._28_4_;
            auVar83 = vfmsub231ps_fma(auVar50,auVar102,auVar106);
            auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar76),ZEXT1632(auVar83));
            auVar85 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar84),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar105 = vrcp14ps_avx512vl(ZEXT1632(auVar85));
            auVar208 = ZEXT3264(auVar105);
            auVar27._8_4_ = 0x3f800000;
            auVar27._0_8_ = 0x3f8000003f800000;
            auVar27._12_4_ = 0x3f800000;
            auVar27._16_4_ = 0x3f800000;
            auVar27._20_4_ = 0x3f800000;
            auVar27._24_4_ = 0x3f800000;
            auVar27._28_4_ = 0x3f800000;
            auVar106 = vfnmadd213ps_avx512vl(auVar105,ZEXT1632(auVar85),auVar27);
            auVar89 = vfmadd132ps_fma(auVar106,auVar105,auVar105);
            auVar205 = ZEXT1664(auVar89);
            auVar51._4_4_ = auVar83._4_4_ * auVar123._4_4_;
            auVar51._0_4_ = auVar83._0_4_ * auVar123._0_4_;
            auVar51._8_4_ = auVar83._8_4_ * auVar123._8_4_;
            auVar51._12_4_ = auVar83._12_4_ * auVar123._12_4_;
            auVar51._16_4_ = fVar211 * 0.0;
            auVar51._20_4_ = fVar210 * 0.0;
            auVar51._24_4_ = fVar163 * 0.0;
            auVar51._28_4_ = iVar1;
            auVar76 = vfmadd231ps_fma(auVar51,auVar92,ZEXT1632(auVar76));
            auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar100,ZEXT1632(auVar84));
            fVar163 = auVar89._0_4_;
            fVar210 = auVar89._4_4_;
            fVar211 = auVar89._8_4_;
            fVar212 = auVar89._12_4_;
            local_3c0 = ZEXT1632(CONCAT412(auVar76._12_4_ * fVar212,
                                           CONCAT48(auVar76._8_4_ * fVar211,
                                                    CONCAT44(auVar76._4_4_ * fVar210,
                                                             auVar76._0_4_ * fVar163))));
            auVar224 = ZEXT3264(local_3c0);
            uVar158 = vcmpps_avx512vl(local_3c0,local_540,0xd);
            uVar141 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar28._4_4_ = uVar141;
            auVar28._0_4_ = uVar141;
            auVar28._8_4_ = uVar141;
            auVar28._12_4_ = uVar141;
            auVar28._16_4_ = uVar141;
            auVar28._20_4_ = uVar141;
            auVar28._24_4_ = uVar141;
            auVar28._28_4_ = uVar141;
            uVar18 = vcmpps_avx512vl(local_3c0,auVar28,2);
            bVar71 = (byte)uVar158 & (byte)uVar18 & bVar71;
            if (bVar71 != 0) {
              uVar72 = vcmpps_avx512vl(ZEXT1632(auVar85),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar72 = bVar71 & uVar72;
              if ((char)uVar72 != '\0') {
                fVar173 = auVar93._0_4_ * fVar163;
                fVar182 = auVar93._4_4_ * fVar210;
                auVar52._4_4_ = fVar182;
                auVar52._0_4_ = fVar173;
                fVar73 = auVar93._8_4_ * fVar211;
                auVar52._8_4_ = fVar73;
                fVar74 = auVar93._12_4_ * fVar212;
                auVar52._12_4_ = fVar74;
                fVar132 = auVar93._16_4_ * 0.0;
                auVar52._16_4_ = fVar132;
                fVar133 = auVar93._20_4_ * 0.0;
                auVar52._20_4_ = fVar133;
                fVar134 = auVar93._24_4_ * 0.0;
                auVar52._24_4_ = fVar134;
                auVar52._28_4_ = auVar93._28_4_;
                auVar172._8_4_ = 0x3f800000;
                auVar172._0_8_ = 0x3f8000003f800000;
                auVar172._12_4_ = 0x3f800000;
                auVar172._16_4_ = 0x3f800000;
                auVar172._20_4_ = 0x3f800000;
                auVar172._24_4_ = 0x3f800000;
                auVar172._28_4_ = 0x3f800000;
                auVar105 = vsubps_avx(auVar172,auVar52);
                local_400._0_4_ =
                     (uint)(bVar60 & 1) * (int)fVar173 | (uint)!(bool)(bVar60 & 1) * auVar105._0_4_;
                bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
                local_400._4_4_ = (uint)bVar10 * (int)fVar182 | (uint)!bVar10 * auVar105._4_4_;
                bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
                local_400._8_4_ = (uint)bVar10 * (int)fVar73 | (uint)!bVar10 * auVar105._8_4_;
                bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
                local_400._12_4_ = (uint)bVar10 * (int)fVar74 | (uint)!bVar10 * auVar105._12_4_;
                bVar10 = (bool)((byte)(uVar62 >> 4) & 1);
                local_400._16_4_ = (uint)bVar10 * (int)fVar132 | (uint)!bVar10 * auVar105._16_4_;
                bVar10 = (bool)((byte)(uVar62 >> 5) & 1);
                local_400._20_4_ = (uint)bVar10 * (int)fVar133 | (uint)!bVar10 * auVar105._20_4_;
                bVar10 = (bool)((byte)(uVar62 >> 6) & 1);
                local_400._24_4_ = (uint)bVar10 * (int)fVar134 | (uint)!bVar10 * auVar105._24_4_;
                bVar10 = SUB81(uVar62 >> 7,0);
                local_400._28_4_ = (uint)bVar10 * auVar93._28_4_ | (uint)!bVar10 * auVar105._28_4_;
                auVar105 = vsubps_avx(auVar95,auVar94);
                auVar89 = vfmadd213ps_fma(auVar105,local_400,auVar94);
                uVar141 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar29._4_4_ = uVar141;
                auVar29._0_4_ = uVar141;
                auVar29._8_4_ = uVar141;
                auVar29._12_4_ = uVar141;
                auVar29._16_4_ = uVar141;
                auVar29._20_4_ = uVar141;
                auVar29._24_4_ = uVar141;
                auVar29._28_4_ = uVar141;
                auVar105 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                              CONCAT48(auVar89._8_4_ + auVar89._8_4_
                                                                       ,CONCAT44(auVar89._4_4_ +
                                                                                 auVar89._4_4_,
                                                                                 auVar89._0_4_ +
                                                                                 auVar89._0_4_)))),
                                           auVar29);
                uVar65 = vcmpps_avx512vl(local_3c0,auVar105,6);
                uVar72 = uVar72 & uVar65;
                bVar71 = (byte)uVar72;
                if (bVar71 != 0) {
                  auVar162._0_4_ = auVar96._0_4_ * fVar163;
                  auVar162._4_4_ = auVar96._4_4_ * fVar210;
                  auVar162._8_4_ = auVar96._8_4_ * fVar211;
                  auVar162._12_4_ = auVar96._12_4_ * fVar212;
                  auVar162._16_4_ = auVar96._16_4_ * 0.0;
                  auVar162._20_4_ = auVar96._20_4_ * 0.0;
                  auVar162._24_4_ = auVar96._24_4_ * 0.0;
                  auVar162._28_4_ = 0;
                  auVar181._8_4_ = 0x3f800000;
                  auVar181._0_8_ = 0x3f8000003f800000;
                  auVar181._12_4_ = 0x3f800000;
                  auVar181._16_4_ = 0x3f800000;
                  auVar181._20_4_ = 0x3f800000;
                  auVar181._24_4_ = 0x3f800000;
                  auVar181._28_4_ = 0x3f800000;
                  auVar105 = vsubps_avx(auVar181,auVar162);
                  auVar128._0_4_ =
                       (uint)(bVar60 & 1) * (int)auVar162._0_4_ |
                       (uint)!(bool)(bVar60 & 1) * auVar105._0_4_;
                  bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
                  auVar128._4_4_ =
                       (uint)bVar10 * (int)auVar162._4_4_ | (uint)!bVar10 * auVar105._4_4_;
                  bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
                  auVar128._8_4_ =
                       (uint)bVar10 * (int)auVar162._8_4_ | (uint)!bVar10 * auVar105._8_4_;
                  bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
                  auVar128._12_4_ =
                       (uint)bVar10 * (int)auVar162._12_4_ | (uint)!bVar10 * auVar105._12_4_;
                  bVar10 = (bool)((byte)(uVar62 >> 4) & 1);
                  auVar128._16_4_ =
                       (uint)bVar10 * (int)auVar162._16_4_ | (uint)!bVar10 * auVar105._16_4_;
                  bVar10 = (bool)((byte)(uVar62 >> 5) & 1);
                  auVar128._20_4_ =
                       (uint)bVar10 * (int)auVar162._20_4_ | (uint)!bVar10 * auVar105._20_4_;
                  bVar10 = (bool)((byte)(uVar62 >> 6) & 1);
                  auVar128._24_4_ =
                       (uint)bVar10 * (int)auVar162._24_4_ | (uint)!bVar10 * auVar105._24_4_;
                  auVar128._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar105._28_4_;
                  auVar30._8_4_ = 0x40000000;
                  auVar30._0_8_ = 0x4000000040000000;
                  auVar30._12_4_ = 0x40000000;
                  auVar30._16_4_ = 0x40000000;
                  auVar30._20_4_ = 0x40000000;
                  auVar30._24_4_ = 0x40000000;
                  auVar30._28_4_ = 0x40000000;
                  local_3e0 = vfmsub132ps_avx512vl(auVar128,auVar181,auVar30);
                  local_3a0 = (undefined4)lVar70;
                  local_380 = local_660;
                  uStack_378 = uStack_658;
                  local_370 = local_670;
                  uStack_368 = uStack_668;
                  local_360 = local_680;
                  uStack_358 = uStack_678;
                  pGVar67 = (context->scene->geometries).items[uVar6].ptr;
                  if ((pGVar67->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar105 = vaddps_avx512vl(local_400,auVar227._0_32_);
                    auVar89 = vcvtsi2ss_avx512f(auVar88,local_3a0);
                    fVar163 = auVar89._0_4_;
                    local_340[0] = (fVar163 + auVar105._0_4_) * local_100;
                    local_340[1] = (fVar163 + auVar105._4_4_) * fStack_fc;
                    local_340[2] = (fVar163 + auVar105._8_4_) * fStack_f8;
                    local_340[3] = (fVar163 + auVar105._12_4_) * fStack_f4;
                    fStack_330 = (fVar163 + auVar105._16_4_) * fStack_f0;
                    fStack_32c = (fVar163 + auVar105._20_4_) * fStack_ec;
                    fStack_328 = (fVar163 + auVar105._24_4_) * fStack_e8;
                    fStack_324 = fVar163 + auVar105._28_4_;
                    local_320 = local_3e0;
                    local_300 = local_3c0;
                    auVar150._8_4_ = 0x7f800000;
                    auVar150._0_8_ = 0x7f8000007f800000;
                    auVar150._12_4_ = 0x7f800000;
                    auVar150._16_4_ = 0x7f800000;
                    auVar150._20_4_ = 0x7f800000;
                    auVar150._24_4_ = 0x7f800000;
                    auVar150._28_4_ = 0x7f800000;
                    auVar105 = vblendmps_avx512vl(auVar150,local_3c0);
                    auVar129._0_4_ =
                         (uint)(bVar71 & 1) * auVar105._0_4_ |
                         (uint)!(bool)(bVar71 & 1) * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar72 >> 1) & 1);
                    auVar129._4_4_ = (uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar72 >> 2) & 1);
                    auVar129._8_4_ = (uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar72 >> 3) & 1);
                    auVar129._12_4_ = (uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar72 >> 4) & 1);
                    auVar129._16_4_ = (uint)bVar10 * auVar105._16_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar72 >> 5) & 1);
                    auVar129._20_4_ = (uint)bVar10 * auVar105._20_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar72 >> 6) & 1);
                    auVar129._24_4_ = (uint)bVar10 * auVar105._24_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = SUB81(uVar72 >> 7,0);
                    auVar129._28_4_ = (uint)bVar10 * auVar105._28_4_ | (uint)!bVar10 * 0x7f800000;
                    auVar105 = vshufps_avx(auVar129,auVar129,0xb1);
                    auVar105 = vminps_avx(auVar129,auVar105);
                    auVar106 = vshufpd_avx(auVar105,auVar105,5);
                    auVar105 = vminps_avx(auVar105,auVar106);
                    auVar106 = vpermpd_avx2(auVar105,0x4e);
                    auVar105 = vminps_avx(auVar105,auVar106);
                    uVar158 = vcmpps_avx512vl(auVar129,auVar105,0);
                    uVar63 = (uint)uVar72;
                    if ((bVar71 & (byte)uVar158) != 0) {
                      uVar63 = (uint)(bVar71 & (byte)uVar158);
                    }
                    uVar64 = 0;
                    for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
                      uVar64 = uVar64 + 1;
                    }
                    uVar62 = (ulong)uVar64;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar67->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_620 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                      local_5f8 = pGVar67;
                      local_588 = lVar66;
                      local_560 = local_3c0;
                      local_39c = iVar7;
                      local_390 = auVar78;
                      do {
                        fVar163 = local_340[uVar62];
                        auVar160._4_4_ = fVar163;
                        auVar160._0_4_ = fVar163;
                        auVar160._8_4_ = fVar163;
                        auVar160._12_4_ = fVar163;
                        local_1c0._16_4_ = fVar163;
                        local_1c0._0_16_ = auVar160;
                        local_1c0._20_4_ = fVar163;
                        local_1c0._24_4_ = fVar163;
                        local_1c0._28_4_ = fVar163;
                        local_1a0 = *(undefined4 *)(local_320 + uVar62 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_300 + uVar62 * 4);
                        local_650.context = context->user;
                        fVar210 = 1.0 - fVar163;
                        auVar22._8_4_ = 0x80000000;
                        auVar22._0_8_ = 0x8000000080000000;
                        auVar22._12_4_ = 0x80000000;
                        auVar76 = vxorps_avx512vl(ZEXT416((uint)fVar210),auVar22);
                        auVar89 = ZEXT416((uint)(fVar163 * fVar210 * 4.0));
                        auVar85 = vfnmsub213ss_fma(auVar160,auVar160,auVar89);
                        auVar89 = vfmadd213ss_fma(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),
                                                  auVar89);
                        auVar208 = ZEXT464(0x3f000000);
                        fVar210 = fVar210 * auVar76._0_4_ * 0.5;
                        fVar211 = auVar85._0_4_ * 0.5;
                        fVar212 = auVar89._0_4_ * 0.5;
                        fVar163 = fVar163 * fVar163 * 0.5;
                        auVar199._0_4_ = fVar163 * fVar155;
                        auVar199._4_4_ = fVar163 * fVar156;
                        auVar199._8_4_ = fVar163 * fVar157;
                        auVar199._12_4_ = fVar163 * fVar59;
                        auVar143._4_4_ = fVar212;
                        auVar143._0_4_ = fVar212;
                        auVar143._8_4_ = fVar212;
                        auVar143._12_4_ = fVar212;
                        auVar89 = vfmadd132ps_fma(auVar143,auVar199,auVar75);
                        auVar189._4_4_ = fVar211;
                        auVar189._0_4_ = fVar211;
                        auVar189._8_4_ = fVar211;
                        auVar189._12_4_ = fVar211;
                        auVar89 = vfmadd132ps_fma(auVar189,auVar89,auVar79);
                        auVar144._4_4_ = fVar210;
                        auVar144._0_4_ = fVar210;
                        auVar144._8_4_ = fVar210;
                        auVar144._12_4_ = fVar210;
                        auVar89 = vfmadd213ps_fma(auVar144,auVar78,auVar89);
                        local_220 = auVar89._0_4_;
                        auVar195._8_4_ = 1;
                        auVar195._0_8_ = 0x100000001;
                        auVar195._12_4_ = 1;
                        auVar195._16_4_ = 1;
                        auVar195._20_4_ = 1;
                        auVar195._24_4_ = 1;
                        auVar195._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar195,ZEXT1632(auVar89));
                        auVar196 = ZEXT3264(local_200);
                        auVar200._8_4_ = 2;
                        auVar200._0_8_ = 0x200000002;
                        auVar200._12_4_ = 2;
                        auVar203._16_4_ = 2;
                        auVar203._0_16_ = auVar200;
                        auVar203._20_4_ = 2;
                        auVar203._24_4_ = 2;
                        auVar203._28_4_ = 2;
                        auVar205 = ZEXT3264(auVar203);
                        local_1e0 = vpermps_avx2(auVar203,ZEXT1632(auVar89));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_2c0._0_8_;
                        uStack_178 = local_2c0._8_8_;
                        uStack_170 = local_2c0._16_8_;
                        uStack_168 = local_2c0._24_8_;
                        local_160 = local_2a0;
                        auVar105 = vpcmpeqd_avx2(local_2a0,local_2a0);
                        local_5e8[1] = auVar105;
                        *local_5e8 = auVar105;
                        local_140 = (local_650.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_650.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_5c0 = local_2e0;
                        local_650.valid = (int *)local_5c0;
                        local_650.geometryUserPtr = pGVar67->userPtr;
                        local_650.hit = (RTCHitN *)&local_220;
                        local_650.N = 8;
                        local_610._0_8_ = uVar62;
                        local_650.ray = (RTCRayN *)ray;
                        if (pGVar67->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar196 = ZEXT1664(local_200._0_16_);
                          auVar205 = ZEXT1664(auVar200);
                          auVar208 = ZEXT1664(auVar208._0_16_);
                          (*pGVar67->intersectionFilterN)(&local_650);
                          auVar224 = ZEXT3264(local_560);
                          pGVar67 = local_5f8;
                          uVar62 = local_610._0_8_;
                        }
                        uVar63 = (uint)uVar62;
                        if (local_5c0 == (undefined1  [32])0x0) {
LAB_0179d667:
                          *(undefined4 *)(ray + k * 4 + 0x100) = local_620._0_4_;
                        }
                        else {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar67->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar196 = ZEXT1664(auVar196._0_16_);
                            auVar205 = ZEXT1664(auVar205._0_16_);
                            auVar208 = ZEXT1664(auVar208._0_16_);
                            (*p_Var9)(&local_650);
                            auVar224 = ZEXT3264(local_560);
                            pGVar67 = local_5f8;
                            uVar63 = local_610._0_4_;
                          }
                          if (local_5c0 == (undefined1  [32])0x0) goto LAB_0179d667;
                          uVar62 = vptestmd_avx512vl(local_5c0,local_5c0);
                          iVar1 = *(int *)(local_650.hit + 4);
                          iVar2 = *(int *)(local_650.hit + 8);
                          iVar53 = *(int *)(local_650.hit + 0xc);
                          iVar54 = *(int *)(local_650.hit + 0x10);
                          iVar55 = *(int *)(local_650.hit + 0x14);
                          iVar56 = *(int *)(local_650.hit + 0x18);
                          iVar57 = *(int *)(local_650.hit + 0x1c);
                          bVar71 = (byte)uVar62;
                          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar62 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar62 >> 6) & 1);
                          bVar16 = SUB81(uVar62 >> 7,0);
                          *(uint *)(local_650.ray + 0x180) =
                               (uint)(bVar71 & 1) * *(int *)local_650.hit |
                               (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x180);
                          *(uint *)(local_650.ray + 0x184) =
                               (uint)bVar10 * iVar1 |
                               (uint)!bVar10 * *(int *)(local_650.ray + 0x184);
                          *(uint *)(local_650.ray + 0x188) =
                               (uint)bVar11 * iVar2 |
                               (uint)!bVar11 * *(int *)(local_650.ray + 0x188);
                          *(uint *)(local_650.ray + 0x18c) =
                               (uint)bVar12 * iVar53 |
                               (uint)!bVar12 * *(int *)(local_650.ray + 0x18c);
                          *(uint *)(local_650.ray + 400) =
                               (uint)bVar13 * iVar54 | (uint)!bVar13 * *(int *)(local_650.ray + 400)
                          ;
                          *(uint *)(local_650.ray + 0x194) =
                               (uint)bVar14 * iVar55 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x194);
                          *(uint *)(local_650.ray + 0x198) =
                               (uint)bVar15 * iVar56 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x198);
                          *(uint *)(local_650.ray + 0x19c) =
                               (uint)bVar16 * iVar57 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x19c);
                          iVar1 = *(int *)(local_650.hit + 0x24);
                          iVar2 = *(int *)(local_650.hit + 0x28);
                          iVar53 = *(int *)(local_650.hit + 0x2c);
                          iVar54 = *(int *)(local_650.hit + 0x30);
                          iVar55 = *(int *)(local_650.hit + 0x34);
                          iVar56 = *(int *)(local_650.hit + 0x38);
                          iVar57 = *(int *)(local_650.hit + 0x3c);
                          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar62 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar62 >> 6) & 1);
                          bVar16 = SUB81(uVar62 >> 7,0);
                          *(uint *)(local_650.ray + 0x1a0) =
                               (uint)(bVar71 & 1) * *(int *)(local_650.hit + 0x20) |
                               (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x1a0);
                          *(uint *)(local_650.ray + 0x1a4) =
                               (uint)bVar10 * iVar1 |
                               (uint)!bVar10 * *(int *)(local_650.ray + 0x1a4);
                          *(uint *)(local_650.ray + 0x1a8) =
                               (uint)bVar11 * iVar2 |
                               (uint)!bVar11 * *(int *)(local_650.ray + 0x1a8);
                          *(uint *)(local_650.ray + 0x1ac) =
                               (uint)bVar12 * iVar53 |
                               (uint)!bVar12 * *(int *)(local_650.ray + 0x1ac);
                          *(uint *)(local_650.ray + 0x1b0) =
                               (uint)bVar13 * iVar54 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x1b0);
                          *(uint *)(local_650.ray + 0x1b4) =
                               (uint)bVar14 * iVar55 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x1b4);
                          *(uint *)(local_650.ray + 0x1b8) =
                               (uint)bVar15 * iVar56 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x1b8);
                          *(uint *)(local_650.ray + 0x1bc) =
                               (uint)bVar16 * iVar57 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x1bc);
                          iVar1 = *(int *)(local_650.hit + 0x44);
                          iVar2 = *(int *)(local_650.hit + 0x48);
                          iVar53 = *(int *)(local_650.hit + 0x4c);
                          iVar54 = *(int *)(local_650.hit + 0x50);
                          iVar55 = *(int *)(local_650.hit + 0x54);
                          iVar56 = *(int *)(local_650.hit + 0x58);
                          iVar57 = *(int *)(local_650.hit + 0x5c);
                          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar62 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar62 >> 6) & 1);
                          bVar16 = SUB81(uVar62 >> 7,0);
                          *(uint *)(local_650.ray + 0x1c0) =
                               (uint)(bVar71 & 1) * *(int *)(local_650.hit + 0x40) |
                               (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x1c0);
                          *(uint *)(local_650.ray + 0x1c4) =
                               (uint)bVar10 * iVar1 |
                               (uint)!bVar10 * *(int *)(local_650.ray + 0x1c4);
                          *(uint *)(local_650.ray + 0x1c8) =
                               (uint)bVar11 * iVar2 |
                               (uint)!bVar11 * *(int *)(local_650.ray + 0x1c8);
                          *(uint *)(local_650.ray + 0x1cc) =
                               (uint)bVar12 * iVar53 |
                               (uint)!bVar12 * *(int *)(local_650.ray + 0x1cc);
                          *(uint *)(local_650.ray + 0x1d0) =
                               (uint)bVar13 * iVar54 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x1d0);
                          *(uint *)(local_650.ray + 0x1d4) =
                               (uint)bVar14 * iVar55 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x1d4);
                          *(uint *)(local_650.ray + 0x1d8) =
                               (uint)bVar15 * iVar56 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x1d8);
                          *(uint *)(local_650.ray + 0x1dc) =
                               (uint)bVar16 * iVar57 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x1dc);
                          iVar1 = *(int *)(local_650.hit + 100);
                          iVar2 = *(int *)(local_650.hit + 0x68);
                          iVar53 = *(int *)(local_650.hit + 0x6c);
                          iVar54 = *(int *)(local_650.hit + 0x70);
                          iVar55 = *(int *)(local_650.hit + 0x74);
                          iVar56 = *(int *)(local_650.hit + 0x78);
                          iVar57 = *(int *)(local_650.hit + 0x7c);
                          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar62 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar62 >> 6) & 1);
                          bVar16 = SUB81(uVar62 >> 7,0);
                          *(uint *)(local_650.ray + 0x1e0) =
                               (uint)(bVar71 & 1) * *(int *)(local_650.hit + 0x60) |
                               (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x1e0);
                          *(uint *)(local_650.ray + 0x1e4) =
                               (uint)bVar10 * iVar1 |
                               (uint)!bVar10 * *(int *)(local_650.ray + 0x1e4);
                          *(uint *)(local_650.ray + 0x1e8) =
                               (uint)bVar11 * iVar2 |
                               (uint)!bVar11 * *(int *)(local_650.ray + 0x1e8);
                          *(uint *)(local_650.ray + 0x1ec) =
                               (uint)bVar12 * iVar53 |
                               (uint)!bVar12 * *(int *)(local_650.ray + 0x1ec);
                          *(uint *)(local_650.ray + 0x1f0) =
                               (uint)bVar13 * iVar54 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x1f0);
                          *(uint *)(local_650.ray + 500) =
                               (uint)bVar14 * iVar55 | (uint)!bVar14 * *(int *)(local_650.ray + 500)
                          ;
                          *(uint *)(local_650.ray + 0x1f8) =
                               (uint)bVar15 * iVar56 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x1f8);
                          *(uint *)(local_650.ray + 0x1fc) =
                               (uint)bVar16 * iVar57 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x1fc);
                          iVar1 = *(int *)(local_650.hit + 0x84);
                          iVar2 = *(int *)(local_650.hit + 0x88);
                          iVar53 = *(int *)(local_650.hit + 0x8c);
                          iVar54 = *(int *)(local_650.hit + 0x90);
                          iVar55 = *(int *)(local_650.hit + 0x94);
                          iVar56 = *(int *)(local_650.hit + 0x98);
                          iVar57 = *(int *)(local_650.hit + 0x9c);
                          bVar10 = (bool)((byte)(uVar62 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar62 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar62 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar62 >> 6) & 1);
                          bVar16 = SUB81(uVar62 >> 7,0);
                          *(uint *)(local_650.ray + 0x200) =
                               (uint)(bVar71 & 1) * *(int *)(local_650.hit + 0x80) |
                               (uint)!(bool)(bVar71 & 1) * *(int *)(local_650.ray + 0x200);
                          *(uint *)(local_650.ray + 0x204) =
                               (uint)bVar10 * iVar1 |
                               (uint)!bVar10 * *(int *)(local_650.ray + 0x204);
                          *(uint *)(local_650.ray + 0x208) =
                               (uint)bVar11 * iVar2 |
                               (uint)!bVar11 * *(int *)(local_650.ray + 0x208);
                          *(uint *)(local_650.ray + 0x20c) =
                               (uint)bVar12 * iVar53 |
                               (uint)!bVar12 * *(int *)(local_650.ray + 0x20c);
                          *(uint *)(local_650.ray + 0x210) =
                               (uint)bVar13 * iVar54 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x210);
                          *(uint *)(local_650.ray + 0x214) =
                               (uint)bVar14 * iVar55 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x214);
                          *(uint *)(local_650.ray + 0x218) =
                               (uint)bVar15 * iVar56 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x218);
                          *(uint *)(local_650.ray + 0x21c) =
                               (uint)bVar16 * iVar57 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x21c);
                          auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_650.ray + 0x220) = auVar105;
                          auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_650.ray + 0x240) = auVar105;
                          auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_650.ray + 0x260) = auVar105;
                          auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_650.hit + 0x100));
                          *(undefined1 (*) [32])(local_650.ray + 0x280) = auVar105;
                          local_620._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                          local_620._4_4_ = 0;
                          local_620._8_4_ = 0;
                          local_620._12_4_ = 0;
                        }
                        bVar71 = ~(byte)(1 << (uVar63 & 0x1f)) & (byte)uVar72;
                        auVar151._4_4_ = local_620._0_4_;
                        auVar151._0_4_ = local_620._0_4_;
                        auVar151._8_4_ = local_620._0_4_;
                        auVar151._12_4_ = local_620._0_4_;
                        auVar151._16_4_ = local_620._0_4_;
                        auVar151._20_4_ = local_620._0_4_;
                        auVar151._24_4_ = local_620._0_4_;
                        auVar151._28_4_ = local_620._0_4_;
                        uVar158 = vcmpps_avx512vl(auVar224._0_32_,auVar151,2);
                        if ((bVar71 & (byte)uVar158) == 0) goto LAB_0179d704;
                        bVar71 = bVar71 & (byte)uVar158;
                        uVar72 = (ulong)bVar71;
                        auVar152._8_4_ = 0x7f800000;
                        auVar152._0_8_ = 0x7f8000007f800000;
                        auVar152._12_4_ = 0x7f800000;
                        auVar152._16_4_ = 0x7f800000;
                        auVar152._20_4_ = 0x7f800000;
                        auVar152._24_4_ = 0x7f800000;
                        auVar152._28_4_ = 0x7f800000;
                        auVar105 = vblendmps_avx512vl(auVar152,auVar224._0_32_);
                        auVar130._0_4_ =
                             (uint)(bVar71 & 1) * auVar105._0_4_ |
                             (uint)!(bool)(bVar71 & 1) * 0x7f800000;
                        bVar10 = (bool)(bVar71 >> 1 & 1);
                        auVar130._4_4_ = (uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar71 >> 2 & 1);
                        auVar130._8_4_ = (uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar71 >> 3 & 1);
                        auVar130._12_4_ =
                             (uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar71 >> 4 & 1);
                        auVar130._16_4_ =
                             (uint)bVar10 * auVar105._16_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar71 >> 5 & 1);
                        auVar130._20_4_ =
                             (uint)bVar10 * auVar105._20_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar71 >> 6 & 1);
                        auVar130._24_4_ =
                             (uint)bVar10 * auVar105._24_4_ | (uint)!bVar10 * 0x7f800000;
                        auVar130._28_4_ =
                             (uint)(bVar71 >> 7) * auVar105._28_4_ |
                             (uint)!(bool)(bVar71 >> 7) * 0x7f800000;
                        auVar105 = vshufps_avx(auVar130,auVar130,0xb1);
                        auVar105 = vminps_avx(auVar130,auVar105);
                        auVar106 = vshufpd_avx(auVar105,auVar105,5);
                        auVar105 = vminps_avx(auVar105,auVar106);
                        auVar106 = vpermpd_avx2(auVar105,0x4e);
                        auVar105 = vminps_avx(auVar105,auVar106);
                        uVar158 = vcmpps_avx512vl(auVar130,auVar105,0);
                        bVar60 = (byte)uVar158 & bVar71;
                        if (bVar60 != 0) {
                          bVar71 = bVar60;
                        }
                        uVar63 = 0;
                        for (uVar64 = (uint)bVar71; (uVar64 & 1) == 0;
                            uVar64 = uVar64 >> 1 | 0x80000000) {
                          uVar63 = uVar63 + 1;
                        }
                        uVar62 = (ulong)uVar63;
                      } while( true );
                    }
                    fVar163 = local_340[uVar62];
                    uVar141 = *(undefined4 *)(local_320 + uVar62 * 4);
                    fVar210 = 1.0 - fVar163;
                    auVar21._8_4_ = 0x80000000;
                    auVar21._0_8_ = 0x8000000080000000;
                    auVar21._12_4_ = 0x80000000;
                    auVar76 = vxorps_avx512vl(ZEXT416((uint)fVar210),auVar21);
                    auVar89 = ZEXT416((uint)(fVar163 * fVar210 * 4.0));
                    auVar85 = vfnmsub213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar89
                                              );
                    auVar89 = vfmadd213ss_fma(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),auVar89)
                    ;
                    fVar210 = fVar210 * auVar76._0_4_ * 0.5;
                    fVar211 = auVar85._0_4_ * 0.5;
                    auVar205 = ZEXT464((uint)fVar211);
                    fVar212 = auVar89._0_4_ * 0.5;
                    fVar173 = fVar163 * fVar163 * 0.5;
                    auVar187._0_4_ = fVar173 * fVar155;
                    auVar187._4_4_ = fVar173 * fVar156;
                    auVar187._8_4_ = fVar173 * fVar157;
                    auVar187._12_4_ = fVar173 * fVar59;
                    auVar169._4_4_ = fVar212;
                    auVar169._0_4_ = fVar212;
                    auVar169._8_4_ = fVar212;
                    auVar169._12_4_ = fVar212;
                    auVar89 = vfmadd132ps_fma(auVar169,auVar187,auVar75);
                    auVar188._4_4_ = fVar211;
                    auVar188._0_4_ = fVar211;
                    auVar188._8_4_ = fVar211;
                    auVar188._12_4_ = fVar211;
                    auVar89 = vfmadd132ps_fma(auVar188,auVar89,auVar79);
                    auVar196 = ZEXT1664(auVar89);
                    auVar170._4_4_ = fVar210;
                    auVar170._0_4_ = fVar210;
                    auVar170._8_4_ = fVar210;
                    auVar170._12_4_ = fVar210;
                    auVar89 = vfmadd213ps_fma(auVar170,auVar78,auVar89);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar62 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar89._0_4_;
                    uVar8 = vextractps_avx(auVar89,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                    uVar8 = vextractps_avx(auVar89,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar8;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar163;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar141;
                    *(undefined4 *)(ray + k * 4 + 0x220) = uVar3;
                    *(uint *)(ray + k * 4 + 0x240) = uVar6;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_0179d33a;
      }
    }
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar20._4_4_ = uVar3;
    auVar20._0_4_ = uVar3;
    auVar20._8_4_ = uVar3;
    auVar20._12_4_ = uVar3;
    uVar158 = vcmpps_avx512vl(auVar226._0_16_,auVar20,2);
    uVar68 = (ulong)((uint)uVar68 & (uint)uVar158);
  } while( true );
LAB_0179d704:
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar225 = ZEXT1664(auVar89);
  auVar226 = ZEXT1664(local_5a0);
  auVar227 = ZEXT3264(_DAT_01f7b060);
  lVar66 = local_588;
LAB_0179d33a:
  lVar70 = lVar70 + 8;
  goto LAB_0179ca44;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }